

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  int iVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  byte bVar64;
  uint uVar65;
  ulong uVar66;
  uint uVar67;
  uint uVar68;
  long lVar69;
  bool bVar70;
  float fVar71;
  float fVar98;
  float fVar99;
  vint4 bi_2;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar72;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar100;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar101;
  undefined8 uVar102;
  vint4 bi_1;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar142;
  float fVar143;
  vint4 bi;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar144;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  float fVar162;
  float fVar163;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar164;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar178;
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  vint4 ai;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar233;
  float fVar235;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar234;
  float fVar236;
  undefined1 auVar232 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar247 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar255;
  float fVar270;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar296 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar283;
  float fVar292;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar321 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar327;
  float fVar337;
  float fVar338;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar339;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  undefined1 local_568 [8];
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined1 local_538 [32];
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined1 local_458 [16];
  undefined1 (*local_448) [16];
  Primitive *local_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [32];
  uint auStack_398 [4];
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [32];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  uint uStack_1e8;
  float afStack_1e4 [7];
  RTCHitN local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar334 [32];
  
  PVar6 = prim[1];
  uVar61 = (ulong)(byte)PVar6;
  lVar63 = uVar61 * 0x25;
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar71 = *(float *)(prim + lVar63 + 0x12);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar63 + 6));
  auVar296._0_4_ = fVar71 * auVar14._0_4_;
  auVar296._4_4_ = fVar71 * auVar14._4_4_;
  auVar296._8_4_ = fVar71 * auVar14._8_4_;
  auVar296._12_4_ = fVar71 * auVar14._12_4_;
  auVar126._0_4_ = fVar71 * auVar15._0_4_;
  auVar126._4_4_ = fVar71 * auVar15._4_4_;
  auVar126._8_4_ = fVar71 * auVar15._8_4_;
  auVar126._12_4_ = fVar71 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar61 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1a + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x1c + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar316._4_4_ = auVar126._0_4_;
  auVar316._0_4_ = auVar126._0_4_;
  auVar316._8_4_ = auVar126._0_4_;
  auVar316._12_4_ = auVar126._0_4_;
  auVar21 = vshufps_avx(auVar126,auVar126,0x55);
  auVar257 = vshufps_avx(auVar126,auVar126,0xaa);
  fVar71 = auVar257._0_4_;
  auVar271._0_4_ = fVar71 * auVar87._0_4_;
  fVar98 = auVar257._4_4_;
  auVar271._4_4_ = fVar98 * auVar87._4_4_;
  fVar99 = auVar257._8_4_;
  auVar271._8_4_ = fVar99 * auVar87._8_4_;
  fVar101 = auVar257._12_4_;
  auVar271._12_4_ = fVar101 * auVar87._12_4_;
  auVar256._0_4_ = auVar186._0_4_ * fVar71;
  auVar256._4_4_ = auVar186._4_4_ * fVar98;
  auVar256._8_4_ = auVar186._8_4_ * fVar99;
  auVar256._12_4_ = auVar186._12_4_ * fVar101;
  auVar240._0_4_ = auVar20._0_4_ * fVar71;
  auVar240._4_4_ = auVar20._4_4_ * fVar98;
  auVar240._8_4_ = auVar20._8_4_ * fVar99;
  auVar240._12_4_ = auVar20._12_4_ * fVar101;
  auVar257 = vfmadd231ps_fma(auVar271,auVar21,auVar15);
  auVar148 = vfmadd231ps_fma(auVar256,auVar21,auVar18);
  auVar21 = vfmadd231ps_fma(auVar240,auVar183,auVar21);
  auVar74 = vfmadd231ps_fma(auVar257,auVar316,auVar14);
  auVar148 = vfmadd231ps_fma(auVar148,auVar316,auVar17);
  auVar75 = vfmadd231ps_fma(auVar21,auVar19,auVar316);
  auVar317._4_4_ = auVar296._0_4_;
  auVar317._0_4_ = auVar296._0_4_;
  auVar317._8_4_ = auVar296._0_4_;
  auVar317._12_4_ = auVar296._0_4_;
  auVar21 = vshufps_avx(auVar296,auVar296,0x55);
  auVar257 = vshufps_avx(auVar296,auVar296,0xaa);
  fVar71 = auVar257._0_4_;
  auVar287._0_4_ = fVar71 * auVar87._0_4_;
  fVar98 = auVar257._4_4_;
  auVar287._4_4_ = fVar98 * auVar87._4_4_;
  fVar99 = auVar257._8_4_;
  auVar287._8_4_ = fVar99 * auVar87._8_4_;
  fVar101 = auVar257._12_4_;
  auVar287._12_4_ = fVar101 * auVar87._12_4_;
  auVar103._0_4_ = auVar186._0_4_ * fVar71;
  auVar103._4_4_ = auVar186._4_4_ * fVar98;
  auVar103._8_4_ = auVar186._8_4_ * fVar99;
  auVar103._12_4_ = auVar186._12_4_ * fVar101;
  auVar73._0_4_ = auVar20._0_4_ * fVar71;
  auVar73._4_4_ = auVar20._4_4_ * fVar98;
  auVar73._8_4_ = auVar20._8_4_ * fVar99;
  auVar73._12_4_ = auVar20._12_4_ * fVar101;
  auVar15 = vfmadd231ps_fma(auVar287,auVar21,auVar15);
  auVar87 = vfmadd231ps_fma(auVar103,auVar21,auVar18);
  auVar18 = vfmadd231ps_fma(auVar73,auVar21,auVar183);
  auVar103 = vfmadd231ps_fma(auVar15,auVar317,auVar14);
  auVar104 = vfmadd231ps_fma(auVar87,auVar317,auVar17);
  auVar328._8_4_ = 0x7fffffff;
  auVar328._0_8_ = 0x7fffffff7fffffff;
  auVar328._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar74,auVar328);
  auVar219._8_4_ = 0x219392ef;
  auVar219._0_8_ = 0x219392ef219392ef;
  auVar219._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar219,1);
  auVar15 = vblendvps_avx(auVar74,auVar219,auVar14);
  auVar14 = vandps_avx(auVar148,auVar328);
  auVar14 = vcmpps_avx(auVar14,auVar219,1);
  auVar87 = vblendvps_avx(auVar148,auVar219,auVar14);
  auVar14 = vandps_avx(auVar75,auVar328);
  auVar14 = vcmpps_avx(auVar14,auVar219,1);
  auVar14 = vblendvps_avx(auVar75,auVar219,auVar14);
  auVar105 = vfmadd231ps_fma(auVar18,auVar317,auVar19);
  auVar17 = vrcpps_avx(auVar15);
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = 0x3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar220);
  auVar74 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar87);
  auVar87 = vfnmadd213ps_fma(auVar87,auVar15,auVar220);
  auVar75 = vfmadd132ps_fma(auVar87,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar220);
  auVar296 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  fVar71 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar63 + 0x16)) *
           *(float *)(prim + lVar63 + 0x1a);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar189._4_4_ = fVar71;
  auVar189._0_4_ = fVar71;
  auVar189._8_4_ = fVar71;
  auVar189._12_4_ = fVar71;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar61 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar73 = vfmadd213ps_fma(auVar15,auVar189,auVar14);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar87);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar61 * 0xd + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar87 = vfmadd213ps_fma(auVar15,auVar189,auVar14);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar61 * 0x12 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  uVar66 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar61 * 2 + uVar66 + 6);
  auVar15 = vpmovsxwd_avx(auVar186);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar17 = vfmadd213ps_fma(auVar15,auVar189,auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar61 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar183);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar18 = vfmadd213ps_fma(auVar15,auVar189,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar61 * 0x1d + 6);
  auVar14 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar61 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar186 = vfmadd213ps_fma(auVar15,auVar189,auVar14);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar61) + 6);
  auVar14 = vpmovsxwd_avx(auVar257);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar61 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar148);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar15 = vfmadd213ps_fma(auVar15,auVar189,auVar14);
  auVar14 = vsubps_avx(auVar73,auVar103);
  auVar200._0_4_ = auVar74._0_4_ * auVar14._0_4_;
  auVar200._4_4_ = auVar74._4_4_ * auVar14._4_4_;
  auVar200._8_4_ = auVar74._8_4_ * auVar14._8_4_;
  auVar200._12_4_ = auVar74._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar87,auVar103);
  auVar127._0_4_ = auVar74._0_4_ * auVar14._0_4_;
  auVar127._4_4_ = auVar74._4_4_ * auVar14._4_4_;
  auVar127._8_4_ = auVar74._8_4_ * auVar14._8_4_;
  auVar127._12_4_ = auVar74._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar17,auVar104);
  auVar179._0_4_ = auVar75._0_4_ * auVar14._0_4_;
  auVar179._4_4_ = auVar75._4_4_ * auVar14._4_4_;
  auVar179._8_4_ = auVar75._8_4_ * auVar14._8_4_;
  auVar179._12_4_ = auVar75._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar18,auVar104);
  auVar104._0_4_ = auVar75._0_4_ * auVar14._0_4_;
  auVar104._4_4_ = auVar75._4_4_ * auVar14._4_4_;
  auVar104._8_4_ = auVar75._8_4_ * auVar14._8_4_;
  auVar104._12_4_ = auVar75._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar186,auVar105);
  auVar154._0_4_ = auVar296._0_4_ * auVar14._0_4_;
  auVar154._4_4_ = auVar296._4_4_ * auVar14._4_4_;
  auVar154._8_4_ = auVar296._8_4_ * auVar14._8_4_;
  auVar154._12_4_ = auVar296._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar15,auVar105);
  auVar74._0_4_ = auVar296._0_4_ * auVar14._0_4_;
  auVar74._4_4_ = auVar296._4_4_ * auVar14._4_4_;
  auVar74._8_4_ = auVar296._8_4_ * auVar14._8_4_;
  auVar74._12_4_ = auVar296._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar200,auVar127);
  auVar15 = vpminsd_avx(auVar179,auVar104);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar154,auVar74);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar241._4_4_ = uVar72;
  auVar241._0_4_ = uVar72;
  auVar241._8_4_ = uVar72;
  auVar241._12_4_ = uVar72;
  auVar15 = vmaxps_avx(auVar15,auVar241);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_2d8._0_4_ = auVar14._0_4_ * 0.99999964;
  local_2d8._4_4_ = auVar14._4_4_ * 0.99999964;
  local_2d8._8_4_ = auVar14._8_4_ * 0.99999964;
  local_2d8._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar200,auVar127);
  auVar15 = vpmaxsd_avx(auVar179,auVar104);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar154,auVar74);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar128._4_4_ = uVar72;
  auVar128._0_4_ = uVar72;
  auVar128._8_4_ = uVar72;
  auVar128._12_4_ = uVar72;
  auVar15 = vminps_avx(auVar15,auVar128);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar75._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar105._1_3_ = 0;
  auVar105[0] = PVar6;
  auVar105[4] = PVar6;
  auVar105._5_3_ = 0;
  auVar105[8] = PVar6;
  auVar105._9_3_ = 0;
  auVar105[0xc] = PVar6;
  auVar105._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar105,_DAT_01f7fcf0);
  auVar14 = vcmpps_avx(local_2d8,auVar75,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar59 = vmovmskps_avx(auVar14);
  if (uVar59 == 0) {
    uVar61 = 0;
LAB_017380d1:
    return (bool)((byte)uVar61 & 1);
  }
  uVar59 = uVar59 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_138 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar336 = ZEXT864(0);
  local_440 = prim;
LAB_01735f0d:
  lVar63 = 0;
  for (uVar61 = (ulong)uVar59; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar63 = lVar63 + 1;
  }
  uVar60 = *(uint *)(local_440 + 2);
  local_2f8 = *(uint *)(local_440 + lVar63 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar60].ptr;
  fVar71 = (pGVar7->time_range).lower;
  fVar99 = pGVar7->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar71) / ((pGVar7->time_range).upper - fVar71));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar21 = vmaxss_avx(auVar336._0_16_,auVar14);
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)local_2f8 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)auVar21._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar69);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar69);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar61);
  lVar63 = uVar61 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar63);
  lVar1 = uVar61 + 2;
  auVar87 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar61 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar9 + lVar10 * lVar2);
  auVar57 = *pauVar3;
  fVar71 = *(float *)pauVar3[1];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar69);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar69);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar61);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar63);
  auVar186 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar98 = *pfVar4;
  fVar101 = pfVar4[1];
  fVar178 = pfVar4[2];
  fVar146 = pfVar4[3];
  auVar305._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar305._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar305._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar305._12_4_ = fVar71 * 0.0;
  auVar318._8_4_ = 0x3f000000;
  auVar318._0_8_ = 0x3f0000003f000000;
  auVar318._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar305,auVar87,auVar318);
  auVar257 = ZEXT816(0) << 0x40;
  auVar19 = vfmadd231ps_fma(auVar19,auVar15,auVar257);
  auVar127 = vfnmadd231ps_fma(auVar19,auVar14,auVar318);
  auVar201._8_4_ = 0x80000000;
  auVar201._0_8_ = 0x8000000080000000;
  auVar201._12_4_ = 0x80000000;
  auVar242._0_4_ = fVar98 * -0.0;
  auVar242._4_4_ = fVar101 * -0.0;
  auVar242._8_4_ = fVar178 * -0.0;
  auVar242._12_4_ = fVar146 * -0.0;
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar186,auVar242);
  auVar221._0_4_ = auVar18._0_4_ + auVar19._0_4_;
  auVar221._4_4_ = auVar18._4_4_ + auVar19._4_4_;
  auVar221._8_4_ = auVar18._8_4_ + auVar19._8_4_;
  auVar221._12_4_ = auVar18._12_4_ + auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar221,auVar17,auVar201);
  auVar202._0_4_ = fVar98 * 0.0;
  auVar202._4_4_ = fVar101 * 0.0;
  auVar202._8_4_ = fVar178 * 0.0;
  auVar202._12_4_ = fVar146 * 0.0;
  auVar183 = vfmadd231ps_fma(auVar202,auVar186,auVar318);
  auVar183 = vfmadd231ps_fma(auVar183,auVar18,auVar257);
  auVar20 = vfnmadd231ps_fma(auVar183,auVar17,auVar318);
  auVar293._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar293._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar293._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar293._12_4_ = fVar71 * 0.5;
  auVar183 = vfmadd231ps_fma(auVar293,auVar257,auVar87);
  auVar183 = vfnmadd231ps_fma(auVar183,auVar318,auVar15);
  auVar74 = vfmadd231ps_fma(auVar183,auVar257,auVar14);
  auVar243._0_4_ = auVar242._0_4_ + auVar186._0_4_;
  auVar243._4_4_ = auVar242._4_4_ + auVar186._4_4_;
  auVar243._8_4_ = auVar242._8_4_ + auVar186._8_4_;
  auVar243._12_4_ = auVar242._12_4_ + auVar186._12_4_;
  auVar183 = vfmadd231ps_fma(auVar243,auVar18,auVar257);
  auVar183 = vfmadd231ps_fma(auVar183,auVar17,auVar201);
  auVar180._0_4_ = fVar98 * 0.5;
  auVar180._4_4_ = fVar101 * 0.5;
  auVar180._8_4_ = fVar178 * 0.5;
  auVar180._12_4_ = fVar146 * 0.5;
  auVar186 = vfmadd231ps_fma(auVar180,auVar257,auVar186);
  auVar18 = vfnmadd231ps_fma(auVar186,auVar318,auVar18);
  auVar186 = vfmadd231ps_fma(auVar18,auVar257,auVar17);
  auVar17 = vshufps_avx(auVar127,auVar127,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar270 = auVar127._0_4_;
  auVar106._0_4_ = fVar270 * auVar18._0_4_;
  fVar283 = auVar127._4_4_;
  auVar106._4_4_ = fVar283 * auVar18._4_4_;
  fVar292 = auVar127._8_4_;
  auVar106._8_4_ = fVar292 * auVar18._8_4_;
  fVar100 = auVar127._12_4_;
  auVar106._12_4_ = fVar100 * auVar18._12_4_;
  auVar75 = vfmsub231ps_fma(auVar106,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar107._0_4_ = fVar270 * auVar18._0_4_;
  auVar107._4_4_ = fVar283 * auVar18._4_4_;
  auVar107._8_4_ = fVar292 * auVar18._8_4_;
  auVar107._12_4_ = fVar100 * auVar18._12_4_;
  auVar296 = vfmsub231ps_fma(auVar107,auVar17,auVar20);
  auVar17 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar18 = vshufps_avx(auVar183,auVar183,0xc9);
  fVar237 = auVar74._0_4_;
  auVar108._0_4_ = fVar237 * auVar18._0_4_;
  fVar238 = auVar74._4_4_;
  auVar108._4_4_ = fVar238 * auVar18._4_4_;
  fVar239 = auVar74._8_4_;
  auVar108._8_4_ = fVar239 * auVar18._8_4_;
  fVar255 = auVar74._12_4_;
  auVar108._12_4_ = fVar255 * auVar18._12_4_;
  auVar73 = vfmsub231ps_fma(auVar108,auVar17,auVar183);
  auVar18 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar109._0_4_ = fVar237 * auVar18._0_4_;
  auVar109._4_4_ = fVar238 * auVar18._4_4_;
  auVar109._8_4_ = fVar239 * auVar18._8_4_;
  auVar109._12_4_ = fVar255 * auVar18._12_4_;
  auVar103 = vfmsub231ps_fma(auVar109,auVar17,auVar186);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar69);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar69);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar63);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar58 = *pauVar3;
  fVar146 = *(float *)pauVar3[1];
  lVar12 = *(long *)(lVar9 + 0x38 + lVar69);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar69);
  auVar284._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar284._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar284._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar284._12_4_ = fVar146 * 0.0;
  auVar186 = vfmadd231ps_fma(auVar284,auVar18,auVar318);
  auVar19 = vfmadd231ps_fma(auVar186,auVar17,ZEXT816(0) << 0x20);
  auVar186 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar61);
  auVar128 = vfnmadd231ps_fma(auVar19,auVar186,auVar318);
  auVar19 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  pfVar4 = (float *)(lVar12 + lVar9 * lVar2);
  fVar98 = *pfVar4;
  fVar101 = pfVar4[1];
  fVar178 = pfVar4[2];
  fVar125 = pfVar4[3];
  auVar147._0_4_ = fVar98 * -0.0;
  auVar147._4_4_ = fVar101 * -0.0;
  auVar147._8_4_ = fVar178 * -0.0;
  auVar147._12_4_ = fVar125 * -0.0;
  auVar20 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar19,auVar147);
  auVar183 = *(undefined1 (*) [16])(lVar12 + lVar63 * lVar9);
  auVar181._0_4_ = auVar183._0_4_ + auVar20._0_4_;
  auVar181._4_4_ = auVar183._4_4_ + auVar20._4_4_;
  auVar181._8_4_ = auVar183._8_4_ + auVar20._8_4_;
  auVar181._12_4_ = auVar183._12_4_ + auVar20._12_4_;
  auVar20 = *(undefined1 (*) [16])(lVar12 + uVar61 * lVar9);
  auVar148 = vfmadd231ps_fma(auVar181,auVar20,auVar201);
  auVar257 = vshufps_avx(auVar148,auVar148,0xc9);
  fVar233 = auVar128._0_4_;
  auVar76._0_4_ = fVar233 * auVar257._0_4_;
  fVar234 = auVar128._4_4_;
  auVar76._4_4_ = fVar234 * auVar257._4_4_;
  fVar235 = auVar128._8_4_;
  auVar76._8_4_ = fVar235 * auVar257._8_4_;
  fVar236 = auVar128._12_4_;
  auVar76._12_4_ = fVar236 * auVar257._12_4_;
  auVar257 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar104 = vfmsub231ps_fma(auVar76,auVar257,auVar148);
  auVar77._0_4_ = fVar98 * 0.0;
  auVar77._4_4_ = fVar101 * 0.0;
  auVar77._8_4_ = fVar178 * 0.0;
  auVar77._12_4_ = fVar125 * 0.0;
  auVar165._8_4_ = 0x3f000000;
  auVar165._0_8_ = 0x3f0000003f000000;
  auVar165._12_4_ = 0x3f000000;
  auVar148 = vfmadd231ps_fma(auVar77,auVar19,auVar165);
  auVar148 = vfmadd231ps_fma(auVar148,auVar183,ZEXT816(0) << 0x20);
  auVar105 = vfnmadd231ps_fma(auVar148,auVar20,auVar165);
  auVar148 = vshufps_avx(auVar105,auVar105,0xc9);
  auVar182._0_4_ = fVar233 * auVar148._0_4_;
  auVar182._4_4_ = fVar234 * auVar148._4_4_;
  auVar182._8_4_ = fVar235 * auVar148._8_4_;
  auVar182._12_4_ = fVar236 * auVar148._12_4_;
  auVar105 = vfmsub231ps_fma(auVar182,auVar257,auVar105);
  auVar78._0_4_ = auVar19._0_4_ + auVar147._0_4_;
  auVar78._4_4_ = auVar19._4_4_ + auVar147._4_4_;
  auVar78._8_4_ = auVar19._8_4_ + auVar147._8_4_;
  auVar78._12_4_ = auVar19._12_4_ + auVar147._12_4_;
  auVar110._0_4_ = fVar98 * 0.5;
  auVar110._4_4_ = fVar101 * 0.5;
  auVar110._8_4_ = fVar178 * 0.5;
  auVar110._12_4_ = fVar125 * 0.5;
  auVar148 = ZEXT416(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar110,auVar148,auVar19);
  auVar257 = vfmadd231ps_fma(auVar78,auVar183,auVar148);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar165,auVar183);
  auVar183 = vfmadd231ps_fma(auVar257,auVar20,auVar201);
  auVar20 = vfmadd231ps_fma(auVar19,auVar148,auVar20);
  auVar329._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar329._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar329._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar329._12_4_ = fVar146 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar329,auVar148,auVar18);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar165,auVar17);
  auVar257 = vfmadd231ps_fma(auVar19,auVar148,auVar186);
  auVar51._12_4_ = 0;
  auVar51._0_12_ = ZEXT812(0);
  auVar19 = vshufps_avx(auVar183,auVar183,0xc9);
  fVar327 = auVar257._0_4_;
  auVar149._0_4_ = fVar327 * auVar19._0_4_;
  fVar337 = auVar257._4_4_;
  auVar149._4_4_ = fVar337 * auVar19._4_4_;
  fVar338 = auVar257._8_4_;
  auVar149._8_4_ = fVar338 * auVar19._8_4_;
  fVar339 = auVar257._12_4_;
  auVar149._12_4_ = fVar339 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar257,auVar257,0xc9);
  auVar126 = vfmsub231ps_fma(auVar149,auVar19,auVar183);
  auVar183 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar79._0_4_ = fVar327 * auVar183._0_4_;
  auVar79._4_4_ = fVar337 * auVar183._4_4_;
  auVar79._8_4_ = fVar338 * auVar183._8_4_;
  auVar79._12_4_ = fVar339 * auVar183._12_4_;
  auVar287 = vfmsub231ps_fma(auVar79,auVar19,auVar20);
  fVar99 = fVar99 - auVar21._0_4_;
  local_5a8 = auVar57._0_4_;
  fStack_5a4 = auVar57._4_4_;
  fStack_5a0 = auVar57._8_4_;
  auVar80._0_4_ = local_5a8 * -0.0;
  auVar80._4_4_ = fStack_5a4 * -0.0;
  auVar80._8_4_ = fStack_5a0 * -0.0;
  auVar80._12_4_ = fVar71 * -0.0;
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar87,auVar80);
  auVar166._0_4_ = auVar87._0_4_ + auVar80._0_4_;
  auVar166._4_4_ = auVar87._4_4_ + auVar80._4_4_;
  auVar166._8_4_ = auVar87._8_4_ + auVar80._8_4_;
  auVar166._12_4_ = auVar87._12_4_ + auVar80._12_4_;
  auVar244._0_4_ = auVar15._0_4_ + auVar19._0_4_;
  auVar244._4_4_ = auVar15._4_4_ + auVar19._4_4_;
  auVar244._8_4_ = auVar15._8_4_ + auVar19._8_4_;
  auVar244._12_4_ = auVar15._12_4_ + auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar166,auVar15,auVar51 << 0x20);
  auVar87 = vpermilps_avx(auVar75,0xc9);
  auVar15 = vdpps_avx(auVar87,auVar87,0x7f);
  auVar20 = vfmadd231ps_fma(auVar244,auVar14,auVar201);
  auVar21 = vfmadd231ps_fma(auVar19,auVar14,auVar201);
  auVar19 = vpermilps_avx(auVar296,0xc9);
  fVar98 = auVar15._0_4_;
  auVar183 = ZEXT416((uint)fVar98);
  auVar14 = vrsqrtss_avx(auVar183,auVar183);
  fVar71 = auVar14._0_4_;
  auVar14 = vdpps_avx(auVar87,auVar19,0x7f);
  fVar71 = fVar71 * 1.5 + fVar98 * -0.5 * fVar71 * fVar71 * fVar71;
  auVar111._0_4_ = fVar98 * auVar19._0_4_;
  auVar111._4_4_ = fVar98 * auVar19._4_4_;
  auVar111._8_4_ = fVar98 * auVar19._8_4_;
  auVar111._12_4_ = fVar98 * auVar19._12_4_;
  fVar98 = auVar14._0_4_;
  auVar203._0_4_ = fVar98 * auVar87._0_4_;
  auVar203._4_4_ = fVar98 * auVar87._4_4_;
  auVar203._8_4_ = fVar98 * auVar87._8_4_;
  auVar203._12_4_ = fVar98 * auVar87._12_4_;
  auVar19 = vsubps_avx(auVar111,auVar203);
  auVar14 = vrcpss_avx(auVar183,auVar183);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,SUB6416(ZEXT464(0x40000000),0));
  fVar101 = auVar14._0_4_ * auVar15._0_4_;
  auVar183 = vpermilps_avx(auVar73,0xc9);
  fVar125 = auVar87._0_4_ * fVar71;
  fVar142 = auVar87._4_4_ * fVar71;
  fVar143 = auVar87._8_4_ * fVar71;
  fVar144 = auVar87._12_4_ * fVar71;
  auVar15 = vdpps_avx(auVar183,auVar183,0x7f);
  auVar14 = vblendps_avx(auVar15,_DAT_01f7aa10,0xe);
  auVar87 = vrsqrtss_avx(auVar14,auVar14);
  fVar178 = auVar15._0_4_;
  fVar98 = auVar87._0_4_;
  fVar98 = fVar98 * 1.5 + fVar98 * fVar98 * fVar178 * -0.5 * fVar98;
  auVar87 = vpermilps_avx(auVar103,0xc9);
  auVar258._0_4_ = fVar178 * auVar87._0_4_;
  auVar258._4_4_ = fVar178 * auVar87._4_4_;
  auVar258._8_4_ = fVar178 * auVar87._8_4_;
  auVar258._12_4_ = fVar178 * auVar87._12_4_;
  auVar87 = vdpps_avx(auVar183,auVar87,0x7f);
  fVar178 = auVar87._0_4_;
  auVar222._0_4_ = fVar178 * auVar183._0_4_;
  auVar222._4_4_ = fVar178 * auVar183._4_4_;
  auVar222._8_4_ = fVar178 * auVar183._8_4_;
  auVar222._12_4_ = fVar178 * auVar183._12_4_;
  auVar87 = vsubps_avx(auVar258,auVar222);
  auVar14 = vrcpss_avx(auVar14,auVar14);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,ZEXT416(0x40000000));
  fVar178 = auVar14._0_4_ * auVar15._0_4_;
  fVar145 = auVar183._0_4_ * fVar98;
  fVar162 = auVar183._4_4_ * fVar98;
  fVar163 = auVar183._8_4_ * fVar98;
  fVar164 = auVar183._12_4_ * fVar98;
  auVar14 = vshufps_avx(auVar127,auVar127,0xff);
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar223._0_4_ = auVar15._0_4_ * fVar125;
  auVar223._4_4_ = auVar15._4_4_ * fVar142;
  auVar223._8_4_ = auVar15._8_4_ * fVar143;
  auVar223._12_4_ = auVar15._12_4_ * fVar144;
  auVar81._0_4_ = auVar14._0_4_ * fVar125 + auVar15._0_4_ * fVar71 * fVar101 * auVar19._0_4_;
  auVar81._4_4_ = auVar14._4_4_ * fVar142 + auVar15._4_4_ * fVar71 * fVar101 * auVar19._4_4_;
  auVar81._8_4_ = auVar14._8_4_ * fVar143 + auVar15._8_4_ * fVar71 * fVar101 * auVar19._8_4_;
  auVar81._12_4_ = auVar14._12_4_ * fVar144 + auVar15._12_4_ * fVar71 * fVar101 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar20,auVar223);
  local_608._0_4_ = auVar20._0_4_ + auVar223._0_4_;
  local_608._4_4_ = auVar20._4_4_ + auVar223._4_4_;
  uStack_600._0_4_ = auVar20._8_4_ + auVar223._8_4_;
  uStack_600._4_4_ = auVar20._12_4_ + auVar223._12_4_;
  auVar183 = vsubps_avx(auVar127,auVar81);
  auVar14 = vshufps_avx(auVar74,auVar74,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar150._0_4_ = auVar15._0_4_ * fVar145;
  auVar150._4_4_ = auVar15._4_4_ * fVar162;
  auVar150._8_4_ = auVar15._8_4_ * fVar163;
  auVar150._12_4_ = auVar15._12_4_ * fVar164;
  auVar184._0_4_ = auVar14._0_4_ * fVar145 + auVar15._0_4_ * fVar98 * auVar87._0_4_ * fVar178;
  auVar184._4_4_ = auVar14._4_4_ * fVar162 + auVar15._4_4_ * fVar98 * auVar87._4_4_ * fVar178;
  auVar184._8_4_ = auVar14._8_4_ * fVar163 + auVar15._8_4_ * fVar98 * auVar87._8_4_ * fVar178;
  auVar184._12_4_ = auVar14._12_4_ * fVar164 + auVar15._12_4_ * fVar98 * auVar87._12_4_ * fVar178;
  auVar87 = vsubps_avx(auVar21,auVar150);
  local_5e8._4_4_ = auVar21._4_4_ + auVar150._4_4_;
  local_5e8._0_4_ = auVar21._0_4_ + auVar150._0_4_;
  fStack_5e0 = auVar21._8_4_ + auVar150._8_4_;
  fStack_5dc = auVar21._12_4_ + auVar150._12_4_;
  auVar20 = vsubps_avx(auVar74,auVar184);
  auVar185._8_4_ = 0x80000000;
  auVar185._0_8_ = 0x8000000080000000;
  auVar185._12_4_ = 0x80000000;
  local_588 = auVar58._0_4_;
  fStack_584 = auVar58._4_4_;
  fStack_580 = auVar58._8_4_;
  auVar151._0_4_ = local_588 * -0.0;
  auVar151._4_4_ = fStack_584 * -0.0;
  auVar151._8_4_ = fStack_580 * -0.0;
  auVar151._12_4_ = fVar146 * -0.0;
  auVar14 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar18,auVar151);
  auVar224._0_4_ = auVar18._0_4_ + auVar151._0_4_;
  auVar224._4_4_ = auVar18._4_4_ + auVar151._4_4_;
  auVar224._8_4_ = auVar18._8_4_ + auVar151._8_4_;
  auVar224._12_4_ = auVar18._12_4_ + auVar151._12_4_;
  auVar319._0_4_ = auVar17._0_4_ + auVar14._0_4_;
  auVar319._4_4_ = auVar17._4_4_ + auVar14._4_4_;
  auVar319._8_4_ = auVar17._8_4_ + auVar14._8_4_;
  auVar319._12_4_ = auVar17._12_4_ + auVar14._12_4_;
  auVar14 = vfmadd231ps_fma(auVar224,auVar17,ZEXT416(0) << 0x20);
  auVar21 = vfmadd231ps_fma(auVar319,auVar186,auVar185);
  auVar148 = vfmadd231ps_fma(auVar14,auVar186,auVar185);
  auVar18 = vpermilps_avx(auVar104,0xc9);
  auVar14 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar98 = auVar14._0_4_;
  auVar186 = ZEXT416((uint)fVar98);
  auVar15 = vrsqrtss_avx(auVar186,auVar186);
  fVar71 = auVar15._0_4_;
  auVar17 = vpermilps_avx(auVar105,0xc9);
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  fVar71 = fVar98 * -0.5 * fVar71 * fVar71 * fVar71 + fVar71 * 1.5;
  auVar245._0_4_ = fVar98 * auVar17._0_4_;
  auVar245._4_4_ = fVar98 * auVar17._4_4_;
  auVar245._8_4_ = fVar98 * auVar17._8_4_;
  auVar245._12_4_ = fVar98 * auVar17._12_4_;
  fVar98 = auVar15._0_4_;
  auVar259._0_4_ = fVar98 * auVar18._0_4_;
  auVar259._4_4_ = fVar98 * auVar18._4_4_;
  auVar259._8_4_ = fVar98 * auVar18._8_4_;
  auVar259._12_4_ = fVar98 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar245,auVar259);
  auVar15 = vrcpss_avx(auVar186,auVar186);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar101 = auVar15._0_4_ * auVar14._0_4_;
  auVar186 = vpermilps_avx(auVar126,0xc9);
  auVar14 = vdpps_avx(auVar186,auVar186,0x7f);
  fVar146 = auVar18._0_4_ * fVar71;
  fVar125 = auVar18._4_4_ * fVar71;
  fVar142 = auVar18._8_4_ * fVar71;
  fVar143 = auVar18._12_4_ * fVar71;
  fVar178 = auVar14._0_4_;
  auVar74 = ZEXT416((uint)fVar178);
  auVar15 = vrsqrtss_avx(auVar74,auVar74);
  fVar98 = auVar15._0_4_;
  fVar98 = fVar98 * 1.5 + fVar178 * -0.5 * fVar98 * fVar98 * fVar98;
  auVar18 = vpermilps_avx(auVar287,0xc9);
  auVar15 = vdpps_avx(auVar186,auVar18,0x7f);
  auVar272._0_4_ = fVar178 * auVar18._0_4_;
  auVar272._4_4_ = fVar178 * auVar18._4_4_;
  auVar272._8_4_ = fVar178 * auVar18._8_4_;
  auVar272._12_4_ = fVar178 * auVar18._12_4_;
  fVar178 = auVar15._0_4_;
  auVar294._0_4_ = fVar178 * auVar186._0_4_;
  auVar294._4_4_ = fVar178 * auVar186._4_4_;
  auVar294._8_4_ = fVar178 * auVar186._8_4_;
  auVar294._12_4_ = fVar178 * auVar186._12_4_;
  auVar18 = vsubps_avx(auVar272,auVar294);
  auVar15 = vrcpss_avx(auVar74,auVar74);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar178 = auVar14._0_4_ * auVar15._0_4_;
  fVar144 = fVar98 * auVar186._0_4_;
  fVar145 = fVar98 * auVar186._4_4_;
  fVar162 = fVar98 * auVar186._8_4_;
  fVar163 = fVar98 * auVar186._12_4_;
  auVar14 = vshufps_avx(auVar128,auVar128,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar152._0_4_ = auVar15._0_4_ * fVar146;
  auVar152._4_4_ = auVar15._4_4_ * fVar125;
  auVar152._8_4_ = auVar15._8_4_ * fVar142;
  auVar152._12_4_ = auVar15._12_4_ * fVar143;
  auVar167._0_4_ = auVar14._0_4_ * fVar146 + auVar15._0_4_ * fVar71 * auVar17._0_4_ * fVar101;
  auVar167._4_4_ = auVar14._4_4_ * fVar125 + auVar15._4_4_ * fVar71 * auVar17._4_4_ * fVar101;
  auVar167._8_4_ = auVar14._8_4_ * fVar142 + auVar15._8_4_ * fVar71 * auVar17._8_4_ * fVar101;
  auVar167._12_4_ = auVar14._12_4_ * fVar143 + auVar15._12_4_ * fVar71 * auVar17._12_4_ * fVar101;
  auVar17 = vsubps_avx(auVar21,auVar152);
  fVar101 = auVar21._0_4_ + auVar152._0_4_;
  fVar146 = auVar21._4_4_ + auVar152._4_4_;
  fVar125 = auVar21._8_4_ + auVar152._8_4_;
  fVar142 = auVar21._12_4_ + auVar152._12_4_;
  auVar186 = vsubps_avx(auVar128,auVar167);
  auVar14 = vshufps_avx(auVar257,auVar257,0xff);
  auVar15 = vshufps_avx(auVar148,auVar148,0xff);
  auVar260._0_4_ = auVar15._0_4_ * fVar144;
  auVar260._4_4_ = auVar15._4_4_ * fVar145;
  auVar260._8_4_ = auVar15._8_4_ * fVar162;
  auVar260._12_4_ = auVar15._12_4_ * fVar163;
  auVar204._0_4_ = fVar144 * auVar14._0_4_ + auVar15._0_4_ * fVar98 * auVar18._0_4_ * fVar178;
  auVar204._4_4_ = fVar145 * auVar14._4_4_ + auVar15._4_4_ * fVar98 * auVar18._4_4_ * fVar178;
  auVar204._8_4_ = fVar162 * auVar14._8_4_ + auVar15._8_4_ * fVar98 * auVar18._8_4_ * fVar178;
  auVar204._12_4_ = fVar163 * auVar14._12_4_ + auVar15._12_4_ * fVar98 * auVar18._12_4_ * fVar178;
  auVar14 = vsubps_avx(auVar148,auVar260);
  auVar168._0_4_ = auVar260._0_4_ + auVar148._0_4_;
  auVar168._4_4_ = auVar260._4_4_ + auVar148._4_4_;
  auVar168._8_4_ = auVar260._8_4_ + auVar148._8_4_;
  auVar168._12_4_ = auVar260._12_4_ + auVar148._12_4_;
  auVar15 = vsubps_avx(auVar257,auVar204);
  local_568._0_4_ = auVar183._0_4_;
  local_568._4_4_ = auVar183._4_4_;
  uStack_560._0_4_ = auVar183._8_4_;
  uStack_560._4_4_ = auVar183._12_4_;
  auVar306._0_4_ = auVar19._0_4_ + (float)local_568._0_4_ * 0.33333334;
  auVar306._4_4_ = auVar19._4_4_ + (float)local_568._4_4_ * 0.33333334;
  auVar306._8_4_ = auVar19._8_4_ + (float)uStack_560 * 0.33333334;
  auVar306._12_4_ = auVar19._12_4_ + uStack_560._4_4_ * 0.33333334;
  fVar71 = 1.0 - fVar99;
  auVar205._4_4_ = fVar71;
  auVar205._0_4_ = fVar71;
  auVar205._8_4_ = fVar71;
  auVar205._12_4_ = fVar71;
  auVar273._0_4_ = fVar99 * auVar17._0_4_;
  auVar273._4_4_ = fVar99 * auVar17._4_4_;
  auVar273._8_4_ = fVar99 * auVar17._8_4_;
  auVar273._12_4_ = fVar99 * auVar17._12_4_;
  local_408 = vfmadd231ps_fma(auVar273,auVar205,auVar19);
  auVar129._0_4_ = fVar99 * (auVar17._0_4_ + auVar186._0_4_ * 0.33333334);
  auVar129._4_4_ = fVar99 * (auVar17._4_4_ + auVar186._4_4_ * 0.33333334);
  auVar129._8_4_ = fVar99 * (auVar17._8_4_ + auVar186._8_4_ * 0.33333334);
  auVar129._12_4_ = fVar99 * (auVar17._12_4_ + auVar186._12_4_ * 0.33333334);
  auVar183 = vfmadd231ps_fma(auVar129,auVar205,auVar306);
  local_5b8 = auVar20._0_4_;
  fStack_5b4 = auVar20._4_4_;
  fStack_5b0 = auVar20._8_4_;
  fStack_5ac = auVar20._12_4_;
  auVar130._0_4_ = local_5b8 * 0.33333334;
  auVar130._4_4_ = fStack_5b4 * 0.33333334;
  auVar130._8_4_ = fStack_5b0 * 0.33333334;
  auVar130._12_4_ = fStack_5ac * 0.33333334;
  auVar17 = vsubps_avx(auVar87,auVar130);
  auVar307._0_4_ = (fVar270 + auVar81._0_4_) * 0.33333334 + (float)local_608._0_4_;
  auVar307._4_4_ = (fVar283 + auVar81._4_4_) * 0.33333334 + (float)local_608._4_4_;
  auVar307._8_4_ = (fVar292 + auVar81._8_4_) * 0.33333334 + (float)uStack_600;
  auVar307._12_4_ = (fVar100 + auVar81._12_4_) * 0.33333334 + uStack_600._4_4_;
  auVar295._0_4_ = (fVar237 + auVar184._0_4_) * 0.33333334;
  auVar295._4_4_ = (fVar238 + auVar184._4_4_) * 0.33333334;
  auVar295._8_4_ = (fVar239 + auVar184._8_4_) * 0.33333334;
  auVar295._12_4_ = (fVar255 + auVar184._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_5e8,auVar295);
  auVar285._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar285._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar285._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar285._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar14,auVar285);
  auVar225._0_4_ = (fVar327 + auVar204._0_4_) * 0.33333334;
  auVar225._4_4_ = (fVar337 + auVar204._4_4_) * 0.33333334;
  auVar225._8_4_ = (fVar338 + auVar204._8_4_) * 0.33333334;
  auVar225._12_4_ = (fVar339 + auVar204._12_4_) * 0.33333334;
  auVar186 = vsubps_avx(auVar168,auVar225);
  auVar286._0_4_ = fVar99 * auVar15._0_4_;
  auVar286._4_4_ = fVar99 * auVar15._4_4_;
  auVar286._8_4_ = fVar99 * auVar15._8_4_;
  auVar286._12_4_ = fVar99 * auVar15._12_4_;
  auVar246._0_4_ = fVar99 * auVar14._0_4_;
  auVar246._4_4_ = fVar99 * auVar14._4_4_;
  auVar246._8_4_ = fVar99 * auVar14._8_4_;
  auVar246._12_4_ = fVar99 * auVar14._12_4_;
  local_418 = vfmadd231ps_fma(auVar286,auVar205,auVar17);
  auVar20 = vfmadd231ps_fma(auVar246,auVar205,auVar87);
  auVar112._0_4_ = fVar99 * fVar101;
  auVar112._4_4_ = fVar99 * fVar146;
  auVar112._8_4_ = fVar99 * fVar125;
  auVar112._12_4_ = fVar99 * fVar142;
  auVar131._0_4_ = fVar99 * (fVar101 + (fVar233 + auVar167._0_4_) * 0.33333334);
  auVar131._4_4_ = fVar99 * (fVar146 + (fVar234 + auVar167._4_4_) * 0.33333334);
  auVar131._8_4_ = fVar99 * (fVar125 + (fVar235 + auVar167._8_4_) * 0.33333334);
  auVar131._12_4_ = fVar99 * (fVar142 + (fVar236 + auVar167._12_4_) * 0.33333334);
  auVar187._0_4_ = fVar99 * auVar186._0_4_;
  auVar187._4_4_ = fVar99 * auVar186._4_4_;
  auVar187._8_4_ = fVar99 * auVar186._8_4_;
  auVar187._12_4_ = fVar99 * auVar186._12_4_;
  auVar169._0_4_ = fVar99 * auVar168._0_4_;
  auVar169._4_4_ = fVar99 * auVar168._4_4_;
  auVar169._8_4_ = fVar99 * auVar168._8_4_;
  auVar169._12_4_ = fVar99 * auVar168._12_4_;
  _local_428 = vfmadd231ps_fma(auVar112,auVar205,_local_608);
  _local_438 = vfmadd231ps_fma(auVar131,auVar205,auVar307);
  auVar21 = vfmadd231ps_fma(auVar187,auVar205,auVar18);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar257 = vfmadd231ps_fma(auVar169,auVar205,_local_5e8);
  local_3e8 = vsubps_avx(local_408,auVar14);
  auVar15 = vshufps_avx(local_3e8,local_3e8,0x55);
  auVar87 = vshufps_avx(local_3e8,local_3e8,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar71 = pre->ray_space[k].vz.field_0.m128[0];
  fVar98 = pre->ray_space[k].vz.field_0.m128[1];
  fVar99 = pre->ray_space[k].vz.field_0.m128[2];
  fVar101 = pre->ray_space[k].vz.field_0.m128[3];
  auVar82._0_4_ = fVar71 * auVar87._0_4_;
  auVar82._4_4_ = fVar98 * auVar87._4_4_;
  auVar82._8_4_ = fVar99 * auVar87._8_4_;
  auVar82._12_4_ = fVar101 * auVar87._12_4_;
  auVar17 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar15);
  local_3f8 = vsubps_avx(auVar183,auVar14);
  auVar15 = vshufps_avx(local_3f8,local_3f8,0x55);
  auVar87 = vshufps_avx(local_3f8,local_3f8,0xaa);
  auVar330._0_4_ = fVar71 * auVar87._0_4_;
  auVar330._4_4_ = fVar98 * auVar87._4_4_;
  auVar330._8_4_ = fVar99 * auVar87._8_4_;
  auVar330._12_4_ = fVar101 * auVar87._12_4_;
  auVar87 = vfmadd231ps_fma(auVar330,(undefined1  [16])aVar5,auVar15);
  local_268 = vsubps_avx(local_418,auVar14);
  auVar15 = vshufps_avx(local_268,local_268,0xaa);
  auVar308._0_4_ = fVar71 * auVar15._0_4_;
  auVar308._4_4_ = fVar98 * auVar15._4_4_;
  auVar308._8_4_ = fVar99 * auVar15._8_4_;
  auVar308._12_4_ = fVar101 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_268,local_268,0x55);
  auVar18 = vfmadd231ps_fma(auVar308,(undefined1  [16])aVar5,auVar15);
  local_278 = vsubps_avx(auVar20,auVar14);
  auVar15 = vshufps_avx(local_278,local_278,0xaa);
  auVar320._0_4_ = fVar71 * auVar15._0_4_;
  auVar320._4_4_ = fVar98 * auVar15._4_4_;
  auVar320._8_4_ = fVar99 * auVar15._8_4_;
  auVar320._12_4_ = fVar101 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_278,local_278,0x55);
  auVar186 = vfmadd231ps_fma(auVar320,(undefined1  [16])aVar5,auVar15);
  local_288 = vsubps_avx(_local_428,auVar14);
  auVar15 = vshufps_avx(local_288,local_288,0xaa);
  auVar170._0_4_ = fVar71 * auVar15._0_4_;
  auVar170._4_4_ = fVar98 * auVar15._4_4_;
  auVar170._8_4_ = fVar99 * auVar15._8_4_;
  auVar170._12_4_ = fVar101 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_288,local_288,0x55);
  auVar19 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar5,auVar15);
  local_298 = vsubps_avx(_local_438,auVar14);
  auVar15 = vshufps_avx(local_298,local_298,0xaa);
  auVar226._0_4_ = fVar71 * auVar15._0_4_;
  auVar226._4_4_ = fVar98 * auVar15._4_4_;
  auVar226._8_4_ = fVar99 * auVar15._8_4_;
  auVar226._12_4_ = fVar101 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_298,local_298,0x55);
  auVar148 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar15);
  local_2a8 = vsubps_avx(auVar21,auVar14);
  auVar15 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar261._0_4_ = fVar71 * auVar15._0_4_;
  auVar261._4_4_ = fVar98 * auVar15._4_4_;
  auVar261._8_4_ = fVar99 * auVar15._8_4_;
  auVar261._12_4_ = fVar101 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_2a8,local_2a8,0x55);
  auVar15 = vfmadd231ps_fma(auVar261,(undefined1  [16])aVar5,auVar15);
  local_2b8 = vsubps_avx(auVar257,auVar14);
  auVar14 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar188._0_4_ = fVar71 * auVar14._0_4_;
  auVar188._4_4_ = fVar98 * auVar14._4_4_;
  auVar188._8_4_ = fVar99 * auVar14._8_4_;
  auVar188._12_4_ = fVar101 * auVar14._12_4_;
  auVar14 = vshufps_avx(local_2b8,local_2b8,0x55);
  auVar14 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar5,auVar14);
  auVar206._4_4_ = local_3e8._0_4_;
  auVar206._0_4_ = local_3e8._0_4_;
  auVar206._8_4_ = local_3e8._0_4_;
  auVar206._12_4_ = local_3e8._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar74 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar206);
  auVar207._4_4_ = local_3f8._0_4_;
  auVar207._0_4_ = local_3f8._0_4_;
  auVar207._8_4_ = local_3f8._0_4_;
  auVar207._12_4_ = local_3f8._0_4_;
  auVar75 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar207);
  uVar72 = local_268._0_4_;
  auVar208._4_4_ = uVar72;
  auVar208._0_4_ = uVar72;
  auVar208._8_4_ = uVar72;
  auVar208._12_4_ = uVar72;
  auVar296 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar208);
  uVar72 = local_278._0_4_;
  auVar209._4_4_ = uVar72;
  auVar209._0_4_ = uVar72;
  auVar209._8_4_ = uVar72;
  auVar209._12_4_ = uVar72;
  auVar73 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar209);
  uVar72 = local_288._0_4_;
  auVar210._4_4_ = uVar72;
  auVar210._0_4_ = uVar72;
  auVar210._8_4_ = uVar72;
  auVar210._12_4_ = uVar72;
  auVar103 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar210);
  uVar72 = local_298._0_4_;
  auVar211._4_4_ = uVar72;
  auVar211._0_4_ = uVar72;
  auVar211._8_4_ = uVar72;
  auVar211._12_4_ = uVar72;
  auVar148 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar5,auVar211);
  uVar72 = local_2a8._0_4_;
  auVar212._4_4_ = uVar72;
  auVar212._0_4_ = uVar72;
  auVar212._8_4_ = uVar72;
  auVar212._12_4_ = uVar72;
  auVar104 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar212);
  uVar72 = local_2b8._0_4_;
  auVar213._4_4_ = uVar72;
  auVar213._0_4_ = uVar72;
  auVar213._8_4_ = uVar72;
  auVar213._12_4_ = uVar72;
  auVar105 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar213);
  auVar17 = vmovlhps_avx(auVar74,auVar103);
  auVar18 = vmovlhps_avx(auVar75,auVar148);
  auVar186 = vmovlhps_avx(auVar296,auVar104);
  auVar19 = vmovlhps_avx(auVar73,auVar105);
  auVar14 = vminps_avx(auVar17,auVar18);
  auVar15 = vminps_avx(auVar186,auVar19);
  auVar87 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar17,auVar18);
  auVar15 = vmaxps_avx(auVar186,auVar19);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vshufpd_avx(auVar87,auVar87,3);
  auVar87 = vminps_avx(auVar87,auVar15);
  auVar15 = vshufpd_avx(auVar14,auVar14,3);
  auVar15 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vandps_avx(auVar328,auVar87);
  auVar15 = vandps_avx(auVar15,auVar328);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vmovshdup_avx(auVar14);
  auVar14 = vmaxss_avx(auVar15,auVar14);
  fVar98 = auVar14._0_4_ * 9.536743e-07;
  auVar247._8_8_ = auVar74._0_8_;
  auVar247._0_8_ = auVar74._0_8_;
  auVar274._8_8_ = auVar75._0_8_;
  auVar274._0_8_ = auVar75._0_8_;
  auVar309._0_8_ = auVar296._0_8_;
  auVar309._8_8_ = auVar309._0_8_;
  auVar321._0_8_ = auVar73._0_8_;
  auVar321._8_8_ = auVar321._0_8_;
  fStack_220 = -fVar98;
  local_228 = -fVar98;
  fStack_224 = -fVar98;
  fStack_21c = fStack_220;
  fStack_218 = fStack_220;
  fStack_214 = fStack_220;
  fStack_210 = fStack_220;
  fStack_20c = fStack_220;
  local_2e8 = uVar60;
  uStack_2e4 = uVar60;
  uStack_2e0 = uVar60;
  uStack_2dc = uVar60;
  uStack_2f4 = local_2f8;
  uStack_2f0 = local_2f8;
  uStack_2ec = local_2f8;
  uVar61 = 0;
  uVar68 = 0;
  fVar71 = *(float *)(ray + k * 4 + 0x30);
  local_238 = vsubps_avx(auVar18,auVar17);
  local_248 = vsubps_avx(auVar186,auVar18);
  local_258 = vsubps_avx(auVar19,auVar186);
  local_308 = vsubps_avx(_local_428,local_408);
  local_318 = vsubps_avx(_local_438,auVar183);
  local_328 = vsubps_avx(auVar21,local_418);
  _local_338 = vsubps_avx(auVar257,auVar20);
  auVar336 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar304 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_208 = fVar98;
  fStack_204 = fVar98;
  fStack_200 = fVar98;
  fStack_1fc = fVar98;
  fStack_1f8 = fVar98;
  fStack_1f4 = fVar98;
  fStack_1f0 = fVar98;
  fStack_1ec = fVar98;
LAB_01736b92:
  local_2c8 = auVar304._0_16_;
  auVar189 = auVar336._0_16_;
  auVar14 = vshufps_avx(auVar189,auVar189,0x50);
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = 0x3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar334._16_4_ = 0x3f800000;
  auVar334._0_16_ = auVar331;
  auVar334._20_4_ = 0x3f800000;
  auVar334._24_4_ = 0x3f800000;
  auVar334._28_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar331,auVar14);
  fVar99 = auVar14._0_4_;
  fVar145 = auVar103._0_4_;
  auVar83._0_4_ = fVar145 * fVar99;
  fVar101 = auVar14._4_4_;
  fVar162 = auVar103._4_4_;
  auVar83._4_4_ = fVar162 * fVar101;
  fVar178 = auVar14._8_4_;
  auVar83._8_4_ = fVar145 * fVar178;
  fVar146 = auVar14._12_4_;
  auVar83._12_4_ = fVar162 * fVar146;
  fVar164 = auVar148._0_4_;
  auVar214._0_4_ = fVar164 * fVar99;
  fVar233 = auVar148._4_4_;
  auVar214._4_4_ = fVar233 * fVar101;
  auVar214._8_4_ = fVar164 * fVar178;
  auVar214._12_4_ = fVar233 * fVar146;
  fVar255 = auVar104._0_4_;
  auVar171._0_4_ = fVar255 * fVar99;
  fVar270 = auVar104._4_4_;
  auVar171._4_4_ = fVar270 * fVar101;
  auVar171._8_4_ = fVar255 * fVar178;
  auVar171._12_4_ = fVar270 * fVar146;
  fVar283 = auVar105._0_4_;
  auVar132._0_4_ = fVar283 * fVar99;
  fVar292 = auVar105._4_4_;
  auVar132._4_4_ = fVar292 * fVar101;
  auVar132._8_4_ = fVar283 * fVar178;
  auVar132._12_4_ = fVar292 * fVar146;
  auVar75 = vfmadd231ps_fma(auVar83,auVar15,auVar247);
  auVar296 = vfmadd231ps_fma(auVar214,auVar15,auVar274);
  auVar73 = vfmadd231ps_fma(auVar171,auVar15,auVar309);
  auVar126 = vfmadd231ps_fma(auVar132,auVar321,auVar15);
  auVar14 = vmovshdup_avx(auVar304._0_16_);
  fVar99 = auVar304._0_4_;
  fStack_c0 = (auVar14._0_4_ - fVar99) * 0.04761905;
  auVar269._4_4_ = fVar99;
  auVar269._0_4_ = fVar99;
  auVar269._8_4_ = fVar99;
  auVar269._12_4_ = fVar99;
  auVar269._16_4_ = fVar99;
  auVar269._20_4_ = fVar99;
  auVar269._24_4_ = fVar99;
  auVar269._28_4_ = fVar99;
  auVar121._0_8_ = auVar14._0_8_;
  auVar121._8_8_ = auVar121._0_8_;
  auVar121._16_8_ = auVar121._0_8_;
  auVar121._24_8_ = auVar121._0_8_;
  auVar95 = vsubps_avx(auVar121,auVar269);
  uVar72 = auVar75._0_4_;
  auVar325._4_4_ = uVar72;
  auVar325._0_4_ = uVar72;
  auVar325._8_4_ = uVar72;
  auVar325._12_4_ = uVar72;
  auVar325._16_4_ = uVar72;
  auVar325._20_4_ = uVar72;
  auVar325._24_4_ = uVar72;
  auVar325._28_4_ = uVar72;
  auVar14 = vmovshdup_avx(auVar75);
  uVar102 = auVar14._0_8_;
  auVar315._8_8_ = uVar102;
  auVar315._0_8_ = uVar102;
  auVar315._16_8_ = uVar102;
  auVar315._24_8_ = uVar102;
  fVar163 = auVar296._0_4_;
  auVar301._4_4_ = fVar163;
  auVar301._0_4_ = fVar163;
  auVar301._8_4_ = fVar163;
  auVar301._12_4_ = fVar163;
  auVar301._16_4_ = fVar163;
  auVar301._20_4_ = fVar163;
  auVar301._24_4_ = fVar163;
  auVar301._28_4_ = fVar163;
  auVar15 = vmovshdup_avx(auVar296);
  auVar122._0_8_ = auVar15._0_8_;
  auVar122._8_8_ = auVar122._0_8_;
  auVar122._16_8_ = auVar122._0_8_;
  auVar122._24_8_ = auVar122._0_8_;
  fVar144 = auVar73._0_4_;
  auVar230._4_4_ = fVar144;
  auVar230._0_4_ = fVar144;
  auVar230._8_4_ = fVar144;
  auVar230._12_4_ = fVar144;
  auVar230._16_4_ = fVar144;
  auVar230._20_4_ = fVar144;
  auVar230._24_4_ = fVar144;
  auVar230._28_4_ = fVar144;
  auVar87 = vmovshdup_avx(auVar73);
  auVar253._0_8_ = auVar87._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar253._16_8_ = auVar253._0_8_;
  auVar253._24_8_ = auVar253._0_8_;
  fVar143 = auVar126._0_4_;
  auVar74 = vmovshdup_avx(auVar126);
  auVar287 = vfmadd132ps_fma(auVar95,auVar269,_DAT_01faff20);
  auVar95 = vsubps_avx(auVar334,ZEXT1632(auVar287));
  fVar99 = auVar287._0_4_;
  fVar101 = auVar287._4_4_;
  auVar22._4_4_ = fVar163 * fVar101;
  auVar22._0_4_ = fVar163 * fVar99;
  fVar178 = auVar287._8_4_;
  auVar22._8_4_ = fVar163 * fVar178;
  fVar146 = auVar287._12_4_;
  auVar22._12_4_ = fVar163 * fVar146;
  auVar22._16_4_ = fVar163 * 0.0;
  auVar22._20_4_ = fVar163 * 0.0;
  auVar22._24_4_ = fVar163 * 0.0;
  auVar22._28_4_ = 0x3f800000;
  auVar287 = vfmadd231ps_fma(auVar22,auVar95,auVar325);
  fVar125 = auVar15._0_4_;
  fVar142 = auVar15._4_4_;
  auVar23._4_4_ = fVar142 * fVar101;
  auVar23._0_4_ = fVar125 * fVar99;
  auVar23._8_4_ = fVar125 * fVar178;
  auVar23._12_4_ = fVar142 * fVar146;
  auVar23._16_4_ = fVar125 * 0.0;
  auVar23._20_4_ = fVar142 * 0.0;
  auVar23._24_4_ = fVar125 * 0.0;
  auVar23._28_4_ = uVar72;
  auVar127 = vfmadd231ps_fma(auVar23,auVar95,auVar315);
  auVar24._4_4_ = fVar144 * fVar101;
  auVar24._0_4_ = fVar144 * fVar99;
  auVar24._8_4_ = fVar144 * fVar178;
  auVar24._12_4_ = fVar144 * fVar146;
  auVar24._16_4_ = fVar144 * 0.0;
  auVar24._20_4_ = fVar144 * 0.0;
  auVar24._24_4_ = fVar144 * 0.0;
  auVar24._28_4_ = auVar14._4_4_;
  auVar128 = vfmadd231ps_fma(auVar24,auVar95,auVar301);
  fVar125 = auVar87._0_4_;
  fVar142 = auVar87._4_4_;
  auVar16._4_4_ = fVar142 * fVar101;
  auVar16._0_4_ = fVar125 * fVar99;
  auVar16._8_4_ = fVar125 * fVar178;
  auVar16._12_4_ = fVar142 * fVar146;
  auVar16._16_4_ = fVar125 * 0.0;
  auVar16._20_4_ = fVar142 * 0.0;
  auVar16._24_4_ = fVar125 * 0.0;
  auVar16._28_4_ = fVar163;
  auVar154 = vfmadd231ps_fma(auVar16,auVar95,auVar122);
  auVar14 = vshufps_avx(auVar75,auVar75,0xaa);
  uStack_560 = auVar14._0_8_;
  local_568 = (undefined1  [8])uStack_560;
  uStack_558 = uStack_560;
  uStack_550 = uStack_560;
  auVar15 = vshufps_avx(auVar75,auVar75,0xff);
  uStack_600 = auVar15._0_8_;
  local_608 = (undefined1  [8])uStack_600;
  uStack_5f8 = uStack_600;
  uStack_5f0 = uStack_600;
  auVar25._4_4_ = fVar143 * fVar101;
  auVar25._0_4_ = fVar143 * fVar99;
  auVar25._8_4_ = fVar143 * fVar178;
  auVar25._12_4_ = fVar143 * fVar146;
  auVar25._16_4_ = fVar143 * 0.0;
  auVar25._20_4_ = fVar143 * 0.0;
  auVar25._24_4_ = fVar143 * 0.0;
  auVar25._28_4_ = fVar143;
  auVar75 = vfmadd231ps_fma(auVar25,auVar95,auVar230);
  auVar15 = vshufps_avx(auVar296,auVar296,0xaa);
  auVar231._0_8_ = auVar15._0_8_;
  auVar231._8_8_ = auVar231._0_8_;
  auVar231._16_8_ = auVar231._0_8_;
  auVar231._24_8_ = auVar231._0_8_;
  auVar87 = vshufps_avx(auVar296,auVar296,0xff);
  local_538._8_8_ = auVar87._0_8_;
  local_538._0_8_ = local_538._8_8_;
  local_538._16_8_ = local_538._8_8_;
  local_538._24_8_ = local_538._8_8_;
  fVar125 = auVar74._0_4_;
  fVar142 = auVar74._4_4_;
  auVar26._4_4_ = fVar142 * fVar101;
  auVar26._0_4_ = fVar125 * fVar99;
  auVar26._8_4_ = fVar125 * fVar178;
  auVar26._12_4_ = fVar142 * fVar146;
  auVar26._16_4_ = fVar125 * 0.0;
  auVar26._20_4_ = fVar142 * 0.0;
  auVar26._24_4_ = fVar125 * 0.0;
  auVar26._28_4_ = auVar14._4_4_;
  auVar179 = vfmadd231ps_fma(auVar26,auVar95,auVar253);
  auVar27._28_4_ = fVar142;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar146,
                          CONCAT48(auVar128._8_4_ * fVar178,
                                   CONCAT44(auVar128._4_4_ * fVar101,auVar128._0_4_ * fVar99))));
  auVar287 = vfmadd231ps_fma(auVar27,auVar95,ZEXT1632(auVar287));
  fVar125 = auVar87._4_4_;
  auVar28._28_4_ = fVar125;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar154._12_4_ * fVar146,
                          CONCAT48(auVar154._8_4_ * fVar178,
                                   CONCAT44(auVar154._4_4_ * fVar101,auVar154._0_4_ * fVar99))));
  auVar127 = vfmadd231ps_fma(auVar28,auVar95,ZEXT1632(auVar127));
  auVar14 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar102 = auVar14._0_8_;
  auVar218._8_8_ = uVar102;
  auVar218._0_8_ = uVar102;
  auVar218._16_8_ = uVar102;
  auVar218._24_8_ = uVar102;
  auVar74 = vshufps_avx(auVar73,auVar73,0xff);
  uVar102 = auVar74._0_8_;
  auVar335._8_8_ = uVar102;
  auVar335._0_8_ = uVar102;
  auVar335._16_8_ = uVar102;
  auVar335._24_8_ = uVar102;
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar75._12_4_ * fVar146,
                                               CONCAT48(auVar75._8_4_ * fVar178,
                                                        CONCAT44(auVar75._4_4_ * fVar101,
                                                                 auVar75._0_4_ * fVar99)))),auVar95,
                            ZEXT1632(auVar128));
  auVar75 = vshufps_avx(auVar126,auVar126,0xaa);
  auVar296 = vshufps_avx(auVar126,auVar126,0xff);
  auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar179._12_4_,
                                                CONCAT48(fVar178 * auVar179._8_4_,
                                                         CONCAT44(fVar101 * auVar179._4_4_,
                                                                  fVar99 * auVar179._0_4_)))),
                             auVar95,ZEXT1632(auVar154));
  auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar73._12_4_,
                                                CONCAT48(fVar178 * auVar73._8_4_,
                                                         CONCAT44(fVar101 * auVar73._4_4_,
                                                                  fVar99 * auVar73._0_4_)))),auVar95
                             ,ZEXT1632(auVar287));
  auVar22 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar287));
  auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar126._12_4_,
                                               CONCAT48(fVar178 * auVar126._8_4_,
                                                        CONCAT44(fVar101 * auVar126._4_4_,
                                                                 fVar99 * auVar126._0_4_)))),auVar95
                            ,ZEXT1632(auVar127));
  auVar23 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar127));
  fStack_47c = auVar23._28_4_;
  auVar302._0_4_ = fStack_c0 * auVar22._0_4_ * 3.0;
  auVar302._4_4_ = fStack_c0 * auVar22._4_4_ * 3.0;
  auVar302._8_4_ = fStack_c0 * auVar22._8_4_ * 3.0;
  auVar302._12_4_ = fStack_c0 * auVar22._12_4_ * 3.0;
  auVar302._16_4_ = fStack_c0 * auVar22._16_4_ * 3.0;
  auVar302._20_4_ = fStack_c0 * auVar22._20_4_ * 3.0;
  auVar302._24_4_ = fStack_c0 * auVar22._24_4_ * 3.0;
  auVar302._28_4_ = 0;
  local_498._0_4_ = fStack_c0 * auVar23._0_4_ * 3.0;
  local_498._4_4_ = fStack_c0 * auVar23._4_4_ * 3.0;
  fStack_490 = fStack_c0 * auVar23._8_4_ * 3.0;
  fStack_48c = fStack_c0 * auVar23._12_4_ * 3.0;
  fStack_488 = fStack_c0 * auVar23._16_4_ * 3.0;
  fStack_484 = fStack_c0 * auVar23._20_4_ * 3.0;
  fStack_480 = fStack_c0 * auVar23._24_4_ * 3.0;
  fVar142 = auVar15._0_4_;
  fVar143 = auVar15._4_4_;
  auVar303._4_4_ = fVar143 * fVar101;
  auVar303._0_4_ = fVar142 * fVar99;
  auVar303._8_4_ = fVar142 * fVar178;
  auVar303._12_4_ = fVar143 * fVar146;
  auVar303._16_4_ = fVar142 * 0.0;
  auVar303._20_4_ = fVar143 * 0.0;
  auVar303._24_4_ = fVar142 * 0.0;
  auVar303._28_4_ = fStack_47c;
  auVar15 = vfmadd231ps_fma(auVar303,auVar95,_local_568);
  fVar142 = auVar87._0_4_;
  auVar30._4_4_ = fVar125 * fVar101;
  auVar30._0_4_ = fVar142 * fVar99;
  auVar30._8_4_ = fVar142 * fVar178;
  auVar30._12_4_ = fVar125 * fVar146;
  auVar30._16_4_ = fVar142 * 0.0;
  auVar30._20_4_ = fVar125 * 0.0;
  auVar30._24_4_ = fVar142 * 0.0;
  auVar30._28_4_ = 0;
  auVar87 = vfmadd231ps_fma(auVar30,auVar95,_local_608);
  fVar125 = auVar14._0_4_;
  fVar142 = auVar14._4_4_;
  auVar31._4_4_ = fVar142 * fVar101;
  auVar31._0_4_ = fVar125 * fVar99;
  auVar31._8_4_ = fVar125 * fVar178;
  auVar31._12_4_ = fVar142 * fVar146;
  auVar31._16_4_ = fVar125 * 0.0;
  auVar31._20_4_ = fVar142 * 0.0;
  auVar31._24_4_ = fVar125 * 0.0;
  auVar31._28_4_ = auVar22._28_4_;
  auVar14 = vfmadd231ps_fma(auVar31,auVar95,auVar231);
  fVar125 = auVar74._0_4_;
  fVar144 = auVar74._4_4_;
  auVar32._4_4_ = fVar144 * fVar101;
  auVar32._0_4_ = fVar125 * fVar99;
  auVar32._8_4_ = fVar125 * fVar178;
  auVar32._12_4_ = fVar144 * fVar146;
  auVar32._16_4_ = fVar125 * 0.0;
  auVar32._20_4_ = fVar144 * 0.0;
  auVar32._24_4_ = fVar125 * 0.0;
  auVar32._28_4_ = fVar143;
  auVar74 = vfmadd231ps_fma(auVar32,auVar95,local_538);
  auVar25 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar128));
  fVar125 = auVar75._0_4_;
  fVar142 = auVar75._4_4_;
  auVar33._4_4_ = fVar142 * fVar101;
  auVar33._0_4_ = fVar125 * fVar99;
  auVar33._8_4_ = fVar125 * fVar178;
  auVar33._12_4_ = fVar142 * fVar146;
  auVar33._16_4_ = fVar125 * 0.0;
  auVar33._20_4_ = fVar142 * 0.0;
  auVar33._24_4_ = fVar125 * 0.0;
  auVar33._28_4_ = fVar142;
  auVar75 = vfmadd231ps_fma(auVar33,auVar95,auVar218);
  auVar26 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar73));
  fVar125 = auVar296._0_4_;
  fVar142 = auVar296._4_4_;
  auVar34._4_4_ = fVar142 * fVar101;
  auVar34._0_4_ = fVar125 * fVar99;
  auVar34._8_4_ = fVar125 * fVar178;
  auVar34._12_4_ = fVar142 * fVar146;
  auVar34._16_4_ = fVar125 * 0.0;
  auVar34._20_4_ = fVar142 * 0.0;
  auVar34._24_4_ = fVar125 * 0.0;
  auVar34._28_4_ = fVar142;
  auVar296 = vfmadd231ps_fma(auVar34,auVar95,auVar335);
  auVar35._28_4_ = fVar144;
  auVar35._0_28_ =
       ZEXT1628(CONCAT412(auVar14._12_4_ * fVar146,
                          CONCAT48(auVar14._8_4_ * fVar178,
                                   CONCAT44(auVar14._4_4_ * fVar101,auVar14._0_4_ * fVar99))));
  auVar15 = vfmadd231ps_fma(auVar35,auVar95,ZEXT1632(auVar15));
  auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar74._12_4_,
                                               CONCAT48(fVar178 * auVar74._8_4_,
                                                        CONCAT44(fVar101 * auVar74._4_4_,
                                                                 fVar99 * auVar74._0_4_)))),auVar95,
                            ZEXT1632(auVar87));
  auVar123._0_4_ = auVar128._0_4_ + auVar302._0_4_;
  auVar123._4_4_ = auVar128._4_4_ + auVar302._4_4_;
  auVar123._8_4_ = auVar128._8_4_ + auVar302._8_4_;
  auVar123._12_4_ = auVar128._12_4_ + auVar302._12_4_;
  auVar123._16_4_ = auVar302._16_4_ + 0.0;
  auVar123._20_4_ = auVar302._20_4_ + 0.0;
  auVar123._24_4_ = auVar302._24_4_ + 0.0;
  auVar123._28_4_ = 0;
  auVar14 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar75._12_4_ * fVar146,
                                               CONCAT48(auVar75._8_4_ * fVar178,
                                                        CONCAT44(auVar75._4_4_ * fVar101,
                                                                 auVar75._0_4_ * fVar99)))),auVar95,
                            ZEXT1632(auVar14));
  auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar296._12_4_ * fVar146,
                                               CONCAT48(auVar296._8_4_ * fVar178,
                                                        CONCAT44(auVar296._4_4_ * fVar101,
                                                                 auVar296._0_4_ * fVar99)))),auVar95
                            ,ZEXT1632(auVar74));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar146 * auVar14._12_4_,
                                               CONCAT48(fVar178 * auVar14._8_4_,
                                                        CONCAT44(fVar101 * auVar14._4_4_,
                                                                 fVar99 * auVar14._0_4_)))),auVar95,
                            ZEXT1632(auVar15));
  auVar296 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar74._12_4_ * fVar146,
                                                CONCAT48(auVar74._8_4_ * fVar178,
                                                         CONCAT44(auVar74._4_4_ * fVar101,
                                                                  auVar74._0_4_ * fVar99)))),
                             ZEXT1632(auVar87),auVar95);
  auVar95 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
  auVar22 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar87));
  auVar326._0_4_ = fStack_c0 * auVar95._0_4_ * 3.0;
  auVar326._4_4_ = fStack_c0 * auVar95._4_4_ * 3.0;
  auVar326._8_4_ = fStack_c0 * auVar95._8_4_ * 3.0;
  auVar326._12_4_ = fStack_c0 * auVar95._12_4_ * 3.0;
  auVar326._16_4_ = fStack_c0 * auVar95._16_4_ * 3.0;
  auVar326._20_4_ = fStack_c0 * auVar95._20_4_ * 3.0;
  auVar326._24_4_ = fStack_c0 * auVar95._24_4_ * 3.0;
  auVar326._28_4_ = 0;
  local_d8 = fStack_c0 * auVar22._0_4_ * 3.0;
  fStack_d4 = fStack_c0 * auVar22._4_4_ * 3.0;
  auVar36._4_4_ = fStack_d4;
  auVar36._0_4_ = local_d8;
  fStack_d0 = fStack_c0 * auVar22._8_4_ * 3.0;
  auVar36._8_4_ = fStack_d0;
  fStack_cc = fStack_c0 * auVar22._12_4_ * 3.0;
  auVar36._12_4_ = fStack_cc;
  fStack_c8 = fStack_c0 * auVar22._16_4_ * 3.0;
  auVar36._16_4_ = fStack_c8;
  fStack_c4 = fStack_c0 * auVar22._20_4_ * 3.0;
  auVar36._20_4_ = fStack_c4;
  fStack_c0 = fStack_c0 * auVar22._24_4_ * 3.0;
  auVar36._24_4_ = fStack_c0;
  auVar36._28_4_ = 0x40400000;
  auVar27 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar296));
  auVar95 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar128));
  auVar22 = vsubps_avx(ZEXT1632(auVar296),ZEXT1632(auVar73));
  auVar23 = vsubps_avx(auVar27,auVar25);
  fVar163 = auVar95._0_4_ + auVar23._0_4_;
  fVar234 = auVar95._4_4_ + auVar23._4_4_;
  fVar235 = auVar95._8_4_ + auVar23._8_4_;
  fVar236 = auVar95._12_4_ + auVar23._12_4_;
  fVar237 = auVar95._16_4_ + auVar23._16_4_;
  fVar238 = auVar95._20_4_ + auVar23._20_4_;
  fVar239 = auVar95._24_4_ + auVar23._24_4_;
  auVar24 = vsubps_avx(local_3b8,auVar26);
  auVar96._0_4_ = auVar22._0_4_ + auVar24._0_4_;
  auVar96._4_4_ = auVar22._4_4_ + auVar24._4_4_;
  auVar96._8_4_ = auVar22._8_4_ + auVar24._8_4_;
  auVar96._12_4_ = auVar22._12_4_ + auVar24._12_4_;
  auVar96._16_4_ = auVar22._16_4_ + auVar24._16_4_;
  auVar96._20_4_ = auVar22._20_4_ + auVar24._20_4_;
  auVar96._24_4_ = auVar22._24_4_ + auVar24._24_4_;
  auVar96._28_4_ = auVar22._28_4_ + auVar24._28_4_;
  local_78 = ZEXT1632(auVar73);
  fVar99 = auVar73._0_4_;
  local_f8 = (float)local_498._0_4_ + fVar99;
  fVar101 = auVar73._4_4_;
  fStack_f4 = (float)local_498._4_4_ + fVar101;
  fVar178 = auVar73._8_4_;
  fStack_f0 = fStack_490 + fVar178;
  fVar146 = auVar73._12_4_;
  fStack_ec = fStack_48c + fVar146;
  fStack_e8 = fStack_488 + 0.0;
  fStack_e4 = fStack_484 + 0.0;
  fStack_e0 = fStack_480 + 0.0;
  local_3d8 = ZEXT1632(auVar128);
  auVar22 = vsubps_avx(local_3d8,auVar302);
  local_358 = vpermps_avx2(_DAT_01fec480,auVar22);
  auVar22 = vsubps_avx(local_78,_local_498);
  local_118 = vpermps_avx2(_DAT_01fec480,auVar22);
  local_98._0_4_ = auVar75._0_4_ + auVar326._0_4_;
  local_98._4_4_ = auVar75._4_4_ + auVar326._4_4_;
  local_98._8_4_ = auVar75._8_4_ + auVar326._8_4_;
  local_98._12_4_ = auVar75._12_4_ + auVar326._12_4_;
  local_98._16_4_ = auVar326._16_4_ + 0.0;
  local_98._20_4_ = auVar326._20_4_ + 0.0;
  local_98._24_4_ = auVar326._24_4_ + 0.0;
  local_98._28_4_ = 0;
  auVar303 = ZEXT1632(auVar75);
  auVar22 = vsubps_avx(auVar303,auVar326);
  auVar28 = vpermps_avx2(_DAT_01fec480,auVar22);
  fVar125 = auVar296._0_4_;
  local_d8 = fVar125 + local_d8;
  fVar142 = auVar296._4_4_;
  fStack_d4 = fVar142 + fStack_d4;
  fVar143 = auVar296._8_4_;
  fStack_d0 = fVar143 + fStack_d0;
  fVar144 = auVar296._12_4_;
  fStack_cc = fVar144 + fStack_cc;
  fStack_c8 = fStack_c8 + 0.0;
  fStack_c4 = fStack_c4 + 0.0;
  fStack_c0 = fStack_c0 + 0.0;
  auVar22 = vsubps_avx(ZEXT1632(auVar296),auVar36);
  local_b8 = vpermps_avx2(_DAT_01fec480,auVar22);
  auVar37._4_4_ = fVar101 * fVar234;
  auVar37._0_4_ = fVar99 * fVar163;
  auVar37._8_4_ = fVar178 * fVar235;
  auVar37._12_4_ = fVar146 * fVar236;
  auVar37._16_4_ = fVar237 * 0.0;
  auVar37._20_4_ = fVar238 * 0.0;
  auVar37._24_4_ = fVar239 * 0.0;
  auVar37._28_4_ = auVar22._28_4_;
  auVar14 = vfnmadd231ps_fma(auVar37,local_3d8,auVar96);
  fStack_dc = fStack_47c + 0.0;
  auVar38._4_4_ = fStack_f4 * fVar234;
  auVar38._0_4_ = local_f8 * fVar163;
  auVar38._8_4_ = fStack_f0 * fVar235;
  auVar38._12_4_ = fStack_ec * fVar236;
  auVar38._16_4_ = fStack_e8 * fVar237;
  auVar38._20_4_ = fStack_e4 * fVar238;
  auVar38._24_4_ = fStack_e0 * fVar239;
  auVar38._28_4_ = 0;
  auVar15 = vfnmadd231ps_fma(auVar38,auVar96,auVar123);
  auVar39._4_4_ = local_118._4_4_ * fVar234;
  auVar39._0_4_ = local_118._0_4_ * fVar163;
  auVar39._8_4_ = local_118._8_4_ * fVar235;
  auVar39._12_4_ = local_118._12_4_ * fVar236;
  auVar39._16_4_ = local_118._16_4_ * fVar237;
  auVar39._20_4_ = local_118._20_4_ * fVar238;
  auVar39._24_4_ = local_118._24_4_ * fVar239;
  auVar39._28_4_ = fStack_47c + 0.0;
  auVar87 = vfnmadd231ps_fma(auVar39,local_358,auVar96);
  local_608._0_4_ = auVar26._0_4_;
  local_608._4_4_ = auVar26._4_4_;
  uStack_600._0_4_ = auVar26._8_4_;
  uStack_600._4_4_ = auVar26._12_4_;
  uStack_5f8._0_4_ = auVar26._16_4_;
  uStack_5f8._4_4_ = auVar26._20_4_;
  uStack_5f0._0_4_ = auVar26._24_4_;
  uStack_5f0._4_4_ = auVar26._28_4_;
  auVar40._4_4_ = (float)local_608._4_4_ * fVar234;
  auVar40._0_4_ = (float)local_608._0_4_ * fVar163;
  auVar40._8_4_ = (float)uStack_600 * fVar235;
  auVar40._12_4_ = uStack_600._4_4_ * fVar236;
  auVar40._16_4_ = (float)uStack_5f8 * fVar237;
  auVar40._20_4_ = uStack_5f8._4_4_ * fVar238;
  auVar40._24_4_ = (float)uStack_5f0 * fVar239;
  auVar40._28_4_ = uStack_5f0._4_4_;
  auVar74 = vfnmadd231ps_fma(auVar40,auVar25,auVar96);
  auVar254._0_4_ = fVar125 * fVar163;
  auVar254._4_4_ = fVar142 * fVar234;
  auVar254._8_4_ = fVar143 * fVar235;
  auVar254._12_4_ = fVar144 * fVar236;
  auVar254._16_4_ = fVar237 * 0.0;
  auVar254._20_4_ = fVar238 * 0.0;
  auVar254._24_4_ = fVar239 * 0.0;
  auVar254._28_4_ = 0;
  auVar75 = vfnmadd231ps_fma(auVar254,auVar303,auVar96);
  uStack_bc = 0x40400000;
  auVar41._4_4_ = fStack_d4 * fVar234;
  auVar41._0_4_ = local_d8 * fVar163;
  auVar41._8_4_ = fStack_d0 * fVar235;
  auVar41._12_4_ = fStack_cc * fVar236;
  auVar41._16_4_ = fStack_c8 * fVar237;
  auVar41._20_4_ = fStack_c4 * fVar238;
  auVar41._24_4_ = fStack_c0 * fVar239;
  auVar41._28_4_ = auVar25._28_4_;
  auVar73 = vfnmadd231ps_fma(auVar41,local_98,auVar96);
  auVar42._4_4_ = local_b8._4_4_ * fVar234;
  auVar42._0_4_ = local_b8._0_4_ * fVar163;
  auVar42._8_4_ = local_b8._8_4_ * fVar235;
  auVar42._12_4_ = local_b8._12_4_ * fVar236;
  auVar42._16_4_ = local_b8._16_4_ * fVar237;
  auVar42._20_4_ = local_b8._20_4_ * fVar238;
  auVar42._24_4_ = local_b8._24_4_ * fVar239;
  auVar42._28_4_ = local_b8._28_4_;
  auVar126 = vfnmadd231ps_fma(auVar42,auVar28,auVar96);
  auVar43._4_4_ = local_3b8._4_4_ * fVar234;
  auVar43._0_4_ = local_3b8._0_4_ * fVar163;
  auVar43._8_4_ = local_3b8._8_4_ * fVar235;
  auVar43._12_4_ = local_3b8._12_4_ * fVar236;
  auVar43._16_4_ = local_3b8._16_4_ * fVar237;
  auVar43._20_4_ = local_3b8._20_4_ * fVar238;
  auVar43._24_4_ = local_3b8._24_4_ * fVar239;
  auVar43._28_4_ = auVar95._28_4_ + auVar23._28_4_;
  auVar287 = vfnmadd231ps_fma(auVar43,auVar27,auVar96);
  auVar22 = vminps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
  auVar95 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
  auVar23 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar74));
  auVar23 = vminps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar74));
  auVar95 = vmaxps_avx(auVar95,auVar22);
  auVar24 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar73));
  auVar22 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar73));
  auVar16 = vminps_avx(ZEXT1632(auVar126),ZEXT1632(auVar287));
  auVar24 = vminps_avx(auVar24,auVar16);
  auVar24 = vminps_avx(auVar23,auVar24);
  auVar23 = vmaxps_avx(ZEXT1632(auVar126),ZEXT1632(auVar287));
  auVar22 = vmaxps_avx(auVar22,auVar23);
  auVar22 = vmaxps_avx(auVar95,auVar22);
  auVar55._4_4_ = fStack_204;
  auVar55._0_4_ = local_208;
  auVar55._8_4_ = fStack_200;
  auVar55._12_4_ = fStack_1fc;
  auVar55._16_4_ = fStack_1f8;
  auVar55._20_4_ = fStack_1f4;
  auVar55._24_4_ = fStack_1f0;
  auVar55._28_4_ = fStack_1ec;
  auVar95 = vcmpps_avx(auVar24,auVar55,2);
  auVar53._4_4_ = fStack_224;
  auVar53._0_4_ = local_228;
  auVar53._8_4_ = fStack_220;
  auVar53._12_4_ = fStack_21c;
  auVar53._16_4_ = fStack_218;
  auVar53._20_4_ = fStack_214;
  auVar53._24_4_ = fStack_210;
  auVar53._28_4_ = fStack_20c;
  auVar22 = vcmpps_avx(auVar22,auVar53,5);
  auVar95 = vandps_avx(auVar22,auVar95);
  auVar22 = local_138 & auVar95;
  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0x7f,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar22 >> 0xbf,0) != '\0') ||
      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0') {
    auVar22 = vsubps_avx(auVar25,local_3d8);
    auVar23 = vsubps_avx(auVar27,auVar303);
    fVar234 = auVar22._0_4_ + auVar23._0_4_;
    fVar235 = auVar22._4_4_ + auVar23._4_4_;
    fVar236 = auVar22._8_4_ + auVar23._8_4_;
    fVar237 = auVar22._12_4_ + auVar23._12_4_;
    fVar238 = auVar22._16_4_ + auVar23._16_4_;
    fVar239 = auVar22._20_4_ + auVar23._20_4_;
    fVar100 = auVar22._24_4_ + auVar23._24_4_;
    auVar24 = vsubps_avx(auVar26,local_78);
    auVar16 = vsubps_avx(local_3b8,ZEXT1632(auVar296));
    auVar124._0_4_ = auVar24._0_4_ + auVar16._0_4_;
    auVar124._4_4_ = auVar24._4_4_ + auVar16._4_4_;
    auVar124._8_4_ = auVar24._8_4_ + auVar16._8_4_;
    auVar124._12_4_ = auVar24._12_4_ + auVar16._12_4_;
    auVar124._16_4_ = auVar24._16_4_ + auVar16._16_4_;
    auVar124._20_4_ = auVar24._20_4_ + auVar16._20_4_;
    auVar124._24_4_ = auVar24._24_4_ + auVar16._24_4_;
    fVar163 = auVar16._28_4_;
    auVar124._28_4_ = auVar24._28_4_ + fVar163;
    auVar44._4_4_ = fVar101 * fVar235;
    auVar44._0_4_ = fVar99 * fVar234;
    auVar44._8_4_ = fVar178 * fVar236;
    auVar44._12_4_ = fVar146 * fVar237;
    auVar44._16_4_ = fVar238 * 0.0;
    auVar44._20_4_ = fVar239 * 0.0;
    auVar44._24_4_ = fVar100 * 0.0;
    auVar44._28_4_ = auVar27._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar44,auVar124,local_3d8);
    auVar45._4_4_ = fVar235 * fStack_f4;
    auVar45._0_4_ = fVar234 * local_f8;
    auVar45._8_4_ = fVar236 * fStack_f0;
    auVar45._12_4_ = fVar237 * fStack_ec;
    auVar45._16_4_ = fVar238 * fStack_e8;
    auVar45._20_4_ = fVar239 * fStack_e4;
    auVar45._24_4_ = fVar100 * fStack_e0;
    auVar45._28_4_ = 0;
    auVar14 = vfnmadd213ps_fma(auVar123,auVar124,auVar45);
    auVar46._4_4_ = fVar235 * local_118._4_4_;
    auVar46._0_4_ = fVar234 * local_118._0_4_;
    auVar46._8_4_ = fVar236 * local_118._8_4_;
    auVar46._12_4_ = fVar237 * local_118._12_4_;
    auVar46._16_4_ = fVar238 * local_118._16_4_;
    auVar46._20_4_ = fVar239 * local_118._20_4_;
    auVar46._24_4_ = fVar100 * local_118._24_4_;
    auVar46._28_4_ = 0;
    auVar15 = vfnmadd213ps_fma(local_358,auVar124,auVar46);
    auVar47._4_4_ = (float)local_608._4_4_ * fVar235;
    auVar47._0_4_ = (float)local_608._0_4_ * fVar234;
    auVar47._8_4_ = (float)uStack_600 * fVar236;
    auVar47._12_4_ = uStack_600._4_4_ * fVar237;
    auVar47._16_4_ = (float)uStack_5f8 * fVar238;
    auVar47._20_4_ = uStack_5f8._4_4_ * fVar239;
    auVar47._24_4_ = (float)uStack_5f0 * fVar100;
    auVar47._28_4_ = 0;
    auVar296 = vfnmadd231ps_fma(auVar47,auVar124,auVar25);
    auVar160._0_4_ = fVar125 * fVar234;
    auVar160._4_4_ = fVar142 * fVar235;
    auVar160._8_4_ = fVar143 * fVar236;
    auVar160._12_4_ = fVar144 * fVar237;
    auVar160._16_4_ = fVar238 * 0.0;
    auVar160._20_4_ = fVar239 * 0.0;
    auVar160._24_4_ = fVar100 * 0.0;
    auVar160._28_4_ = 0;
    auVar73 = vfnmadd231ps_fma(auVar160,auVar124,auVar303);
    auVar48._4_4_ = fVar235 * fStack_d4;
    auVar48._0_4_ = fVar234 * local_d8;
    auVar48._8_4_ = fVar236 * fStack_d0;
    auVar48._12_4_ = fVar237 * fStack_cc;
    auVar48._16_4_ = fVar238 * fStack_c8;
    auVar48._20_4_ = fVar239 * fStack_c4;
    auVar48._24_4_ = fVar100 * fStack_c0;
    auVar48._28_4_ = fVar163;
    auVar87 = vfnmadd213ps_fma(local_98,auVar124,auVar48);
    auVar49._4_4_ = fVar235 * local_b8._4_4_;
    auVar49._0_4_ = fVar234 * local_b8._0_4_;
    auVar49._8_4_ = fVar236 * local_b8._8_4_;
    auVar49._12_4_ = fVar237 * local_b8._12_4_;
    auVar49._16_4_ = fVar238 * local_b8._16_4_;
    auVar49._20_4_ = fVar239 * local_b8._20_4_;
    auVar49._24_4_ = fVar100 * local_b8._24_4_;
    auVar49._28_4_ = fVar163;
    auVar74 = vfnmadd213ps_fma(auVar28,auVar124,auVar49);
    auVar50._4_4_ = local_3b8._4_4_ * fVar235;
    auVar50._0_4_ = local_3b8._0_4_ * fVar234;
    auVar50._8_4_ = local_3b8._8_4_ * fVar236;
    auVar50._12_4_ = local_3b8._12_4_ * fVar237;
    auVar50._16_4_ = local_3b8._16_4_ * fVar238;
    auVar50._20_4_ = local_3b8._20_4_ * fVar239;
    auVar50._24_4_ = local_3b8._24_4_ * fVar100;
    auVar50._28_4_ = auVar22._28_4_ + auVar23._28_4_;
    auVar126 = vfnmadd231ps_fma(auVar50,auVar27,auVar124);
    auVar23 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar14));
    auVar22 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar14));
    auVar24 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar296));
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar296));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar16 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar87));
    auVar23 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar87));
    auVar25 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar126));
    auVar16 = vminps_avx(auVar16,auVar25);
    auVar16 = vminps_avx(auVar24,auVar16);
    auVar24 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar126));
    auVar23 = vmaxps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(auVar22,auVar23);
    auVar56._4_4_ = fStack_204;
    auVar56._0_4_ = local_208;
    auVar56._8_4_ = fStack_200;
    auVar56._12_4_ = fStack_1fc;
    auVar56._16_4_ = fStack_1f8;
    auVar56._20_4_ = fStack_1f4;
    auVar56._24_4_ = fStack_1f0;
    auVar56._28_4_ = fStack_1ec;
    auVar22 = vcmpps_avx(auVar16,auVar56,2);
    auVar54._4_4_ = fStack_224;
    auVar54._0_4_ = local_228;
    auVar54._8_4_ = fStack_220;
    auVar54._12_4_ = fStack_21c;
    auVar54._16_4_ = fStack_218;
    auVar54._20_4_ = fStack_214;
    auVar54._24_4_ = fStack_210;
    auVar54._28_4_ = fStack_20c;
    auVar23 = vcmpps_avx(auVar23,auVar54,5);
    auVar22 = vandps_avx(auVar23,auVar22);
    auVar95 = vandps_avx(local_138,auVar95);
    auVar23 = auVar95 & auVar22;
    auVar336 = ZEXT864(0) << 0x20;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
    goto LAB_01737123;
    auVar95 = vandps_avx(auVar22,auVar95);
    uVar67 = vmovmskps_avx(auVar95);
    if (uVar67 == 0) goto LAB_01737123;
    uVar62 = (ulong)uVar68;
    auStack_398[uVar62] = uVar67 & 0xff;
    uVar102 = vmovlps_avx(local_2c8);
    *(undefined8 *)(&uStack_1e8 + uVar62 * 2) = uVar102;
    uVar66 = vmovlps_avx(auVar189);
    auStack_58[uVar62] = uVar66;
    uVar68 = uVar68 + 1;
    goto LAB_01737123;
  }
LAB_01736fcd:
  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_01737123:
  if (uVar68 == 0) {
    if ((uVar61 & 1) != 0) goto LAB_017380d1;
    uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar94._4_4_ = uVar72;
    auVar94._0_4_ = uVar72;
    auVar94._8_4_ = uVar72;
    auVar94._12_4_ = uVar72;
    auVar14 = vcmpps_avx(local_2d8,auVar94,2);
    uVar60 = vmovmskps_avx(auVar14);
    uVar59 = uVar59 & uVar59 + 0xf & uVar60;
    if (uVar59 == 0) goto LAB_017380d1;
    goto LAB_01735f0d;
  }
  uVar62 = (ulong)(uVar68 - 1);
  uVar65 = auStack_398[uVar62];
  uVar67 = (&uStack_1e8)[uVar62 * 2];
  fVar99 = afStack_1e4[uVar62 * 2];
  iVar29 = 0;
  for (uVar66 = (ulong)uVar65; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    iVar29 = iVar29 + 1;
  }
  uVar65 = uVar65 - 1 & uVar65;
  if (uVar65 == 0) {
    uVar68 = uVar68 - 1;
  }
  auVar190._8_8_ = 0;
  auVar190._0_8_ = auStack_58[uVar62];
  auVar336 = ZEXT1664(auVar190);
  auStack_398[uVar62] = uVar65;
  fVar101 = (float)(iVar29 + 1) * 0.14285715;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * (float)iVar29 * 0.14285715)),ZEXT416(uVar67),
                            ZEXT416((uint)(1.0 - (float)iVar29 * 0.14285715)));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * fVar101)),ZEXT416(uVar67),
                            ZEXT416((uint)(1.0 - fVar101)));
  fVar101 = auVar15._0_4_;
  fVar178 = auVar14._0_4_;
  fVar99 = fVar101 - fVar178;
  if (0.16666667 <= fVar99) {
    auVar14 = vinsertps_avx(auVar14,auVar15,0x10);
    auVar304 = ZEXT1664(auVar14);
    goto LAB_01736b92;
  }
  auVar87 = vshufps_avx(auVar190,auVar190,0x50);
  auVar113._8_4_ = 0x3f800000;
  auVar113._0_8_ = 0x3f8000003f800000;
  auVar113._12_4_ = 0x3f800000;
  auVar74 = vsubps_avx(auVar113,auVar87);
  fVar146 = auVar87._0_4_;
  auVar172._0_4_ = fVar146 * fVar145;
  fVar125 = auVar87._4_4_;
  auVar172._4_4_ = fVar125 * fVar162;
  fVar142 = auVar87._8_4_;
  auVar172._8_4_ = fVar142 * fVar145;
  fVar143 = auVar87._12_4_;
  auVar172._12_4_ = fVar143 * fVar162;
  auVar191._0_4_ = fVar164 * fVar146;
  auVar191._4_4_ = fVar233 * fVar125;
  auVar191._8_4_ = fVar164 * fVar142;
  auVar191._12_4_ = fVar233 * fVar143;
  auVar215._0_4_ = fVar255 * fVar146;
  auVar215._4_4_ = fVar270 * fVar125;
  auVar215._8_4_ = fVar255 * fVar142;
  auVar215._12_4_ = fVar270 * fVar143;
  auVar84._0_4_ = fVar283 * fVar146;
  auVar84._4_4_ = fVar292 * fVar125;
  auVar84._8_4_ = fVar283 * fVar142;
  auVar84._12_4_ = fVar292 * fVar143;
  auVar87 = vfmadd231ps_fma(auVar172,auVar74,auVar247);
  auVar75 = vfmadd231ps_fma(auVar191,auVar74,auVar274);
  auVar296 = vfmadd231ps_fma(auVar215,auVar74,auVar309);
  auVar74 = vfmadd231ps_fma(auVar84,auVar74,auVar321);
  auVar161._16_16_ = auVar87;
  auVar161._0_16_ = auVar87;
  auVar177._16_16_ = auVar75;
  auVar177._0_16_ = auVar75;
  auVar199._16_16_ = auVar296;
  auVar199._0_16_ = auVar296;
  auVar232._4_4_ = fVar178;
  auVar232._0_4_ = fVar178;
  auVar232._8_4_ = fVar178;
  auVar232._12_4_ = fVar178;
  auVar232._20_4_ = fVar101;
  auVar232._16_4_ = fVar101;
  auVar232._24_4_ = fVar101;
  auVar232._28_4_ = fVar101;
  auVar95 = vsubps_avx(auVar177,auVar161);
  auVar75 = vfmadd213ps_fma(auVar95,auVar232,auVar161);
  auVar95 = vsubps_avx(auVar199,auVar177);
  auVar73 = vfmadd213ps_fma(auVar95,auVar232,auVar177);
  auVar87 = vsubps_avx(auVar74,auVar296);
  auVar97._16_16_ = auVar87;
  auVar97._0_16_ = auVar87;
  auVar87 = vfmadd213ps_fma(auVar97,auVar232,auVar199);
  auVar95 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar75));
  auVar74 = vfmadd213ps_fma(auVar95,auVar232,ZEXT1632(auVar75));
  auVar95 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar73));
  auVar87 = vfmadd213ps_fma(auVar95,auVar232,ZEXT1632(auVar73));
  auVar95 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar74));
  auVar127 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar95,auVar232);
  fVar146 = fVar99 * 0.33333334;
  auVar227._0_8_ =
       CONCAT44(auVar127._4_4_ + fVar146 * auVar95._4_4_ * 3.0,
                auVar127._0_4_ + fVar146 * auVar95._0_4_ * 3.0);
  auVar227._8_4_ = auVar127._8_4_ + fVar146 * auVar95._8_4_ * 3.0;
  auVar227._12_4_ = auVar127._12_4_ + fVar146 * auVar95._12_4_ * 3.0;
  auVar74 = vshufpd_avx(auVar127,auVar127,3);
  auVar75 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
  auVar87 = vsubps_avx(auVar74,auVar127);
  auVar296 = vsubps_avx(auVar75,(undefined1  [16])0x0);
  auVar85._0_4_ = auVar87._0_4_ + auVar296._0_4_;
  auVar85._4_4_ = auVar87._4_4_ + auVar296._4_4_;
  auVar85._8_4_ = auVar87._8_4_ + auVar296._8_4_;
  auVar85._12_4_ = auVar87._12_4_ + auVar296._12_4_;
  auVar87 = vshufps_avx(auVar127,auVar127,0xb1);
  auVar296 = vshufps_avx(auVar227,auVar227,0xb1);
  auVar322._4_4_ = auVar85._0_4_;
  auVar322._0_4_ = auVar85._0_4_;
  auVar322._8_4_ = auVar85._0_4_;
  auVar322._12_4_ = auVar85._0_4_;
  auVar73 = vshufps_avx(auVar85,auVar85,0x55);
  fVar125 = auVar73._0_4_;
  auVar86._0_4_ = fVar125 * auVar87._0_4_;
  fVar142 = auVar73._4_4_;
  auVar86._4_4_ = fVar142 * auVar87._4_4_;
  fVar143 = auVar73._8_4_;
  auVar86._8_4_ = fVar143 * auVar87._8_4_;
  fVar144 = auVar73._12_4_;
  auVar86._12_4_ = fVar144 * auVar87._12_4_;
  auVar192._0_4_ = fVar125 * auVar296._0_4_;
  auVar192._4_4_ = fVar142 * auVar296._4_4_;
  auVar192._8_4_ = fVar143 * auVar296._8_4_;
  auVar192._12_4_ = fVar144 * auVar296._12_4_;
  auVar126 = vfmadd231ps_fma(auVar86,auVar322,auVar127);
  local_3b8._0_16_ = auVar227;
  auVar287 = vfmadd231ps_fma(auVar192,auVar322,auVar227);
  auVar296 = vshufps_avx(auVar126,auVar126,0xe8);
  auVar73 = vshufps_avx(auVar287,auVar287,0xe8);
  auVar87 = vcmpps_avx(auVar296,auVar73,1);
  uVar67 = vextractps_avx(auVar87,0);
  auVar128 = auVar287;
  if ((uVar67 & 1) == 0) {
    auVar128 = auVar126;
  }
  auVar153._0_4_ = fVar146 * auVar95._16_4_ * 3.0;
  auVar153._4_4_ = fVar146 * auVar95._20_4_ * 3.0;
  auVar153._8_4_ = fVar146 * auVar95._24_4_ * 3.0;
  auVar153._12_4_ = fVar146 * 0.0;
  auVar200 = vsubps_avx((undefined1  [16])0x0,auVar153);
  auVar154 = vshufps_avx(auVar200,auVar200,0xb1);
  auVar179 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
  auVar228._0_4_ = fVar125 * auVar154._0_4_;
  auVar228._4_4_ = fVar142 * auVar154._4_4_;
  auVar228._8_4_ = fVar143 * auVar154._8_4_;
  auVar228._12_4_ = fVar144 * auVar154._12_4_;
  auVar248._0_4_ = auVar179._0_4_ * fVar125;
  auVar248._4_4_ = auVar179._4_4_ * fVar142;
  auVar248._8_4_ = auVar179._8_4_ * fVar143;
  auVar248._12_4_ = auVar179._12_4_ * fVar144;
  local_3d8._0_16_ = auVar200;
  auVar219 = vfmadd231ps_fma(auVar228,auVar322,auVar200);
  auVar220 = vfmadd231ps_fma(auVar248,(undefined1  [16])0x0,auVar322);
  auVar179 = vshufps_avx(auVar219,auVar219,0xe8);
  auVar189 = vshufps_avx(auVar220,auVar220,0xe8);
  auVar154 = vcmpps_avx(auVar179,auVar189,1);
  uVar67 = vextractps_avx(auVar154,0);
  auVar240 = auVar220;
  if ((uVar67 & 1) == 0) {
    auVar240 = auVar219;
  }
  auVar128 = vmaxss_avx(auVar240,auVar128);
  auVar296 = vminps_avx(auVar296,auVar73);
  auVar73 = vminps_avx(auVar179,auVar189);
  auVar73 = vminps_avx(auVar296,auVar73);
  auVar87 = vshufps_avx(auVar87,auVar87,0x55);
  auVar87 = vblendps_avx(auVar87,auVar154,2);
  auVar154 = vpslld_avx(auVar87,0x1f);
  auVar87 = vshufpd_avx(auVar287,auVar287,1);
  auVar87 = vinsertps_avx(auVar87,auVar220,0x9c);
  auVar296 = vshufpd_avx(auVar126,auVar126,1);
  auVar296 = vinsertps_avx(auVar296,auVar219,0x9c);
  auVar87 = vblendvps_avx(auVar296,auVar87,auVar154);
  auVar296 = vmovshdup_avx(auVar87);
  auVar87 = vmaxss_avx(auVar296,auVar87);
  fVar143 = auVar73._0_4_;
  auVar296 = vmovshdup_avx(auVar73);
  fVar142 = auVar87._0_4_;
  fVar146 = auVar296._0_4_;
  fVar125 = auVar128._0_4_;
  if (((0.0001 <= fVar143) || (fVar142 <= -0.0001)) && (0.0001 <= fVar146 || fVar142 <= -0.0001)) {
    auVar296 = vcmpps_avx(auVar296,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar126 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar296 = vandps_avx(auVar126,auVar296);
    if (fVar125 <= -0.0001 || (auVar296 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_01736fcd;
  }
  auVar126 = vcmpps_avx(auVar73,_DAT_01f7aa10,1);
  auVar287 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar296 = vcmpss_avx(auVar128,ZEXT816(0) << 0x20,1);
  auVar133._8_4_ = 0xbf800000;
  auVar133._0_8_ = 0xbf800000bf800000;
  auVar133._12_4_ = 0xbf800000;
  auVar296 = vblendvps_avx(auVar113,auVar133,auVar296);
  auVar126 = vblendvps_avx(auVar113,auVar133,auVar126);
  fVar163 = auVar126._0_4_;
  fVar144 = auVar296._0_4_;
  auVar296 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar163 == fVar144) && (!NAN(fVar163) && !NAN(fVar144))) {
    auVar296 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar163 == fVar144) && (!NAN(fVar163) && !NAN(fVar144))) {
    auVar287 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar126 = vmovshdup_avx(auVar126);
  fVar234 = auVar126._0_4_;
  if ((fVar163 != fVar234) || (NAN(fVar163) || NAN(fVar234))) {
    if ((fVar146 != fVar143) || (NAN(fVar146) || NAN(fVar143))) {
      auVar155._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
      auVar155._8_4_ = auVar73._8_4_ ^ 0x80000000;
      auVar155._12_4_ = auVar73._12_4_ ^ 0x80000000;
      auVar156._0_4_ = -fVar143 / (fVar146 - fVar143);
      auVar156._4_12_ = auVar155._4_12_;
      auVar52._12_4_ = 0;
      auVar52._0_12_ = ZEXT812(0);
      auVar336 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar73 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar52 << 0x20,auVar156);
      auVar126 = auVar73;
    }
    else {
      auVar73 = ZEXT816(0) << 0x20;
      auVar336 = ZEXT1264(ZEXT812(0)) << 0x20;
      if ((fVar143 != 0.0) || (auVar126 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar143))) {
        auVar73 = SUB6416(ZEXT464(0x7f800000),0);
        auVar126 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar296 = vminss_avx(auVar296,auVar73);
    auVar287 = vmaxss_avx(auVar126,auVar287);
  }
  else {
    auVar336 = ZEXT1264(ZEXT812(0)) << 0x20;
  }
  auVar73 = auVar336._0_16_;
  auVar87 = vcmpss_avx(auVar87,auVar73,1);
  auVar134._8_4_ = 0xbf800000;
  auVar134._0_8_ = 0xbf800000bf800000;
  auVar134._12_4_ = 0xbf800000;
  auVar87 = vblendvps_avx(auVar113,auVar134,auVar87);
  fVar146 = auVar87._0_4_;
  if ((fVar144 != fVar146) || (NAN(fVar144) || NAN(fVar146))) {
    if ((fVar142 != fVar125) || (NAN(fVar142) || NAN(fVar125))) {
      auVar88._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
      auVar88._8_4_ = auVar128._8_4_ ^ 0x80000000;
      auVar88._12_4_ = auVar128._12_4_ ^ 0x80000000;
      auVar157._0_4_ = -fVar125 / (fVar142 - fVar125);
      auVar157._4_12_ = auVar88._4_12_;
      auVar87 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar157._0_4_)),auVar73,auVar157);
      auVar126 = auVar87;
    }
    else {
      auVar87 = ZEXT816(0) << 0x20;
      if ((fVar125 != 0.0) || (auVar126 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar125))) {
        auVar87 = SUB6416(ZEXT464(0x7f800000),0);
        auVar126 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar296 = vminss_avx(auVar296,auVar87);
    auVar287 = vmaxss_avx(auVar126,auVar287);
  }
  auVar87 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar234 != fVar146) || (NAN(fVar234) || NAN(fVar146))) {
    auVar296 = vminss_avx(auVar296,auVar87);
    auVar287 = vmaxss_avx(auVar87,auVar287);
  }
  auVar296 = vmaxss_avx(auVar73,auVar296);
  auVar126 = vminss_avx(auVar287,auVar87);
  if (auVar296._0_4_ <= auVar126._0_4_) {
    auVar296 = vmaxss_avx(auVar73,ZEXT416((uint)(auVar296._0_4_ + -0.1)));
    auVar87 = vminss_avx(ZEXT416((uint)(auVar126._0_4_ + 0.1)),auVar87);
    auVar173._0_8_ = auVar127._0_8_;
    auVar173._8_8_ = auVar173._0_8_;
    auVar262._8_8_ = auVar227._0_8_;
    auVar262._0_8_ = auVar227._0_8_;
    auVar275._8_8_ = auVar200._0_8_;
    auVar275._0_8_ = auVar200._0_8_;
    auVar73 = vshufpd_avx(auVar227,auVar227,3);
    auVar126 = vshufpd_avx(auVar200,auVar200,3);
    auVar287 = vshufps_avx(auVar296,auVar87,0);
    auVar127 = vsubps_avx(auVar113,auVar287);
    local_498._0_4_ = auVar74._0_4_;
    local_498._4_4_ = auVar74._4_4_;
    fStack_490 = auVar74._8_4_;
    fStack_48c = auVar74._12_4_;
    fVar146 = auVar287._0_4_;
    auVar89._0_4_ = fVar146 * (float)local_498._0_4_;
    fVar125 = auVar287._4_4_;
    auVar89._4_4_ = fVar125 * (float)local_498._4_4_;
    fVar142 = auVar287._8_4_;
    auVar89._8_4_ = fVar142 * fStack_490;
    fVar143 = auVar287._12_4_;
    auVar89._12_4_ = fVar143 * fStack_48c;
    auVar216._0_4_ = fVar146 * auVar73._0_4_;
    auVar216._4_4_ = fVar125 * auVar73._4_4_;
    auVar216._8_4_ = fVar142 * auVar73._8_4_;
    auVar216._12_4_ = fVar143 * auVar73._12_4_;
    auVar229._0_4_ = fVar146 * auVar126._0_4_;
    auVar229._4_4_ = fVar125 * auVar126._4_4_;
    auVar229._8_4_ = fVar142 * auVar126._8_4_;
    auVar229._12_4_ = fVar143 * auVar126._12_4_;
    local_478 = auVar75._0_4_;
    fStack_474 = auVar75._4_4_;
    fStack_470 = auVar75._8_4_;
    fStack_46c = auVar75._12_4_;
    auVar249._0_4_ = fVar146 * local_478;
    auVar249._4_4_ = fVar125 * fStack_474;
    auVar249._8_4_ = fVar142 * fStack_470;
    auVar249._12_4_ = fVar143 * fStack_46c;
    auVar73 = vfmadd231ps_fma(auVar89,auVar127,auVar173);
    auVar126 = vfmadd231ps_fma(auVar216,auVar127,auVar262);
    auVar287 = vfmadd231ps_fma(auVar229,auVar127,auVar275);
    auVar127 = vfmadd231ps_fma(auVar249,auVar127,ZEXT816(0));
    auVar74 = vmovshdup_avx(auVar190);
    auVar200 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar296._0_4_)),auVar190,
                               ZEXT416((uint)(1.0 - auVar296._0_4_)));
    auVar219 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar87._0_4_)),auVar190,
                               ZEXT416((uint)(1.0 - auVar87._0_4_)));
    fVar146 = 1.0 / fVar99;
    auVar87 = vsubps_avx(auVar126,auVar73);
    auVar263._0_4_ = auVar87._0_4_ * 3.0;
    auVar263._4_4_ = auVar87._4_4_ * 3.0;
    auVar263._8_4_ = auVar87._8_4_ * 3.0;
    auVar263._12_4_ = auVar87._12_4_ * 3.0;
    auVar87 = vsubps_avx(auVar287,auVar126);
    auVar276._0_4_ = auVar87._0_4_ * 3.0;
    auVar276._4_4_ = auVar87._4_4_ * 3.0;
    auVar276._8_4_ = auVar87._8_4_ * 3.0;
    auVar276._12_4_ = auVar87._12_4_ * 3.0;
    auVar87 = vsubps_avx(auVar127,auVar287);
    auVar288._0_4_ = auVar87._0_4_ * 3.0;
    auVar288._4_4_ = auVar87._4_4_ * 3.0;
    auVar288._8_4_ = auVar87._8_4_ * 3.0;
    auVar288._12_4_ = auVar87._12_4_ * 3.0;
    auVar74 = vminps_avx(auVar276,auVar288);
    auVar87 = vmaxps_avx(auVar276,auVar288);
    auVar74 = vminps_avx(auVar263,auVar74);
    auVar87 = vmaxps_avx(auVar263,auVar87);
    auVar75 = vshufpd_avx(auVar74,auVar74,3);
    auVar296 = vshufpd_avx(auVar87,auVar87,3);
    auVar74 = vminps_avx(auVar74,auVar75);
    auVar87 = vmaxps_avx(auVar87,auVar296);
    auVar277._0_4_ = auVar74._0_4_ * fVar146;
    auVar277._4_4_ = auVar74._4_4_ * fVar146;
    auVar277._8_4_ = auVar74._8_4_ * fVar146;
    auVar277._12_4_ = auVar74._12_4_ * fVar146;
    auVar264._0_4_ = auVar87._0_4_ * fVar146;
    auVar264._4_4_ = auVar87._4_4_ * fVar146;
    auVar264._8_4_ = auVar87._8_4_ * fVar146;
    auVar264._12_4_ = auVar87._12_4_ * fVar146;
    fVar146 = 1.0 / (auVar219._0_4_ - auVar200._0_4_);
    auVar87 = vshufpd_avx(auVar73,auVar73,3);
    auVar74 = vshufpd_avx(auVar126,auVar126,3);
    auVar75 = vshufpd_avx(auVar287,auVar287,3);
    auVar296 = vshufpd_avx(auVar127,auVar127,3);
    auVar87 = vsubps_avx(auVar87,auVar73);
    auVar73 = vsubps_avx(auVar74,auVar126);
    auVar126 = vsubps_avx(auVar75,auVar287);
    auVar296 = vsubps_avx(auVar296,auVar127);
    auVar74 = vminps_avx(auVar87,auVar73);
    auVar87 = vmaxps_avx(auVar87,auVar73);
    auVar75 = vminps_avx(auVar126,auVar296);
    auVar75 = vminps_avx(auVar74,auVar75);
    auVar74 = vmaxps_avx(auVar126,auVar296);
    auVar87 = vmaxps_avx(auVar87,auVar74);
    auVar310._0_4_ = fVar146 * auVar75._0_4_;
    auVar310._4_4_ = fVar146 * auVar75._4_4_;
    auVar310._8_4_ = fVar146 * auVar75._8_4_;
    auVar310._12_4_ = fVar146 * auVar75._12_4_;
    auVar297._0_4_ = fVar146 * auVar87._0_4_;
    auVar297._4_4_ = fVar146 * auVar87._4_4_;
    auVar297._8_4_ = fVar146 * auVar87._8_4_;
    auVar297._12_4_ = fVar146 * auVar87._12_4_;
    auVar296 = vinsertps_avx(auVar14,auVar200,0x10);
    auVar73 = vinsertps_avx(auVar15,auVar219,0x10);
    auVar289._0_4_ = (auVar296._0_4_ + auVar73._0_4_) * 0.5;
    auVar289._4_4_ = (auVar296._4_4_ + auVar73._4_4_) * 0.5;
    auVar289._8_4_ = (auVar296._8_4_ + auVar73._8_4_) * 0.5;
    auVar289._12_4_ = (auVar296._12_4_ + auVar73._12_4_) * 0.5;
    auVar90._4_4_ = auVar289._0_4_;
    auVar90._0_4_ = auVar289._0_4_;
    auVar90._8_4_ = auVar289._0_4_;
    auVar90._12_4_ = auVar289._0_4_;
    auVar87 = vfmadd213ps_fma(local_238,auVar90,auVar17);
    auVar74 = vfmadd213ps_fma(local_248,auVar90,auVar18);
    auVar75 = vfmadd213ps_fma(local_258,auVar90,auVar186);
    auVar15 = vsubps_avx(auVar74,auVar87);
    auVar87 = vfmadd213ps_fma(auVar15,auVar90,auVar87);
    auVar15 = vsubps_avx(auVar75,auVar74);
    auVar15 = vfmadd213ps_fma(auVar15,auVar90,auVar74);
    auVar15 = vsubps_avx(auVar15,auVar87);
    auVar87 = vfmadd231ps_fma(auVar87,auVar15,auVar90);
    auVar91._0_8_ = CONCAT44(auVar15._4_4_ * 3.0,auVar15._0_4_ * 3.0);
    auVar91._8_4_ = auVar15._8_4_ * 3.0;
    auVar91._12_4_ = auVar15._12_4_ * 3.0;
    auVar323._8_8_ = auVar87._0_8_;
    auVar323._0_8_ = auVar87._0_8_;
    auVar15 = vshufpd_avx(auVar87,auVar87,3);
    auVar87 = vshufps_avx(auVar289,auVar289,0x55);
    auVar287 = vsubps_avx(auVar15,auVar323);
    auVar128 = vfmadd231ps_fma(auVar323,auVar87,auVar287);
    auVar332._8_8_ = auVar91._0_8_;
    auVar332._0_8_ = auVar91._0_8_;
    auVar15 = vshufpd_avx(auVar91,auVar91,3);
    auVar15 = vsubps_avx(auVar15,auVar332);
    auVar127 = vfmadd213ps_fma(auVar15,auVar87,auVar332);
    auVar87 = vmovshdup_avx(auVar127);
    auVar333._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
    auVar333._8_4_ = auVar87._8_4_ ^ 0x80000000;
    auVar333._12_4_ = auVar87._12_4_ ^ 0x80000000;
    auVar74 = vmovshdup_avx(auVar287);
    auVar15 = vunpcklps_avx(auVar74,auVar333);
    auVar75 = vshufps_avx(auVar15,auVar333,4);
    auVar126 = vshufps_avx(auVar289,auVar289,0x54);
    auVar158._0_8_ = auVar287._0_8_ ^ 0x8000000080000000;
    auVar158._8_4_ = auVar287._8_4_ ^ 0x80000000;
    auVar158._12_4_ = auVar287._12_4_ ^ 0x80000000;
    auVar15 = vmovlhps_avx(auVar158,auVar127);
    auVar15 = vshufps_avx(auVar15,auVar127,8);
    auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar287._0_4_ * auVar87._0_4_)),auVar74,auVar127);
    uVar72 = auVar87._0_4_;
    auVar92._4_4_ = uVar72;
    auVar92._0_4_ = uVar72;
    auVar92._8_4_ = uVar72;
    auVar92._12_4_ = uVar72;
    auVar87 = vdivps_avx(auVar75,auVar92);
    auVar74 = vdivps_avx(auVar15,auVar92);
    fVar142 = auVar128._0_4_;
    fVar146 = auVar87._0_4_;
    auVar15 = vshufps_avx(auVar128,auVar128,0x55);
    fVar125 = auVar74._0_4_;
    auVar93._0_4_ = fVar142 * fVar146 + auVar15._0_4_ * fVar125;
    auVar93._4_4_ = fVar142 * auVar87._4_4_ + auVar15._4_4_ * auVar74._4_4_;
    auVar93._8_4_ = fVar142 * auVar87._8_4_ + auVar15._8_4_ * auVar74._8_4_;
    auVar93._12_4_ = fVar142 * auVar87._12_4_ + auVar15._12_4_ * auVar74._12_4_;
    auVar189 = vsubps_avx(auVar126,auVar93);
    auVar126 = vmovshdup_avx(auVar87);
    auVar15 = vinsertps_avx(auVar277,auVar310,0x1c);
    auVar193._0_4_ = auVar126._0_4_ * auVar15._0_4_;
    auVar193._4_4_ = auVar126._4_4_ * auVar15._4_4_;
    auVar193._8_4_ = auVar126._8_4_ * auVar15._8_4_;
    auVar193._12_4_ = auVar126._12_4_ * auVar15._12_4_;
    auVar75 = vinsertps_avx(auVar264,auVar297,0x1c);
    auVar114._0_4_ = auVar75._0_4_ * auVar126._0_4_;
    auVar114._4_4_ = auVar75._4_4_ * auVar126._4_4_;
    auVar114._8_4_ = auVar75._8_4_ * auVar126._8_4_;
    auVar114._12_4_ = auVar75._12_4_ * auVar126._12_4_;
    auVar128 = vminps_avx(auVar193,auVar114);
    auVar127 = vmaxps_avx(auVar114,auVar193);
    auVar126 = vinsertps_avx(auVar310,auVar277,0x4c);
    auVar154 = vmovshdup_avx(auVar74);
    auVar287 = vinsertps_avx(auVar297,auVar264,0x4c);
    auVar298._0_4_ = auVar154._0_4_ * auVar126._0_4_;
    auVar298._4_4_ = auVar154._4_4_ * auVar126._4_4_;
    auVar298._8_4_ = auVar154._8_4_ * auVar126._8_4_;
    auVar298._12_4_ = auVar154._12_4_ * auVar126._12_4_;
    auVar278._0_4_ = auVar154._0_4_ * auVar287._0_4_;
    auVar278._4_4_ = auVar154._4_4_ * auVar287._4_4_;
    auVar278._8_4_ = auVar154._8_4_ * auVar287._8_4_;
    auVar278._12_4_ = auVar154._12_4_ * auVar287._12_4_;
    auVar154 = vminps_avx(auVar298,auVar278);
    auVar311._0_4_ = auVar128._0_4_ + auVar154._0_4_;
    auVar311._4_4_ = auVar128._4_4_ + auVar154._4_4_;
    auVar311._8_4_ = auVar128._8_4_ + auVar154._8_4_;
    auVar311._12_4_ = auVar128._12_4_ + auVar154._12_4_;
    auVar128 = vmaxps_avx(auVar278,auVar298);
    auVar115._0_4_ = auVar128._0_4_ + auVar127._0_4_;
    auVar115._4_4_ = auVar128._4_4_ + auVar127._4_4_;
    auVar115._8_4_ = auVar128._8_4_ + auVar127._8_4_;
    auVar115._12_4_ = auVar128._12_4_ + auVar127._12_4_;
    auVar279._8_8_ = 0x3f80000000000000;
    auVar279._0_8_ = 0x3f80000000000000;
    auVar127 = vsubps_avx(auVar279,auVar115);
    auVar128 = vsubps_avx(auVar279,auVar311);
    auVar154 = vsubps_avx(auVar296,auVar289);
    auVar179 = vsubps_avx(auVar73,auVar289);
    auVar135._0_4_ = fVar146 * auVar15._0_4_;
    auVar135._4_4_ = fVar146 * auVar15._4_4_;
    auVar135._8_4_ = fVar146 * auVar15._8_4_;
    auVar135._12_4_ = fVar146 * auVar15._12_4_;
    auVar312._0_4_ = fVar146 * auVar75._0_4_;
    auVar312._4_4_ = fVar146 * auVar75._4_4_;
    auVar312._8_4_ = fVar146 * auVar75._8_4_;
    auVar312._12_4_ = fVar146 * auVar75._12_4_;
    auVar75 = vminps_avx(auVar135,auVar312);
    auVar15 = vmaxps_avx(auVar312,auVar135);
    auVar194._0_4_ = fVar125 * auVar126._0_4_;
    auVar194._4_4_ = fVar125 * auVar126._4_4_;
    auVar194._8_4_ = fVar125 * auVar126._8_4_;
    auVar194._12_4_ = fVar125 * auVar126._12_4_;
    auVar265._0_4_ = fVar125 * auVar287._0_4_;
    auVar265._4_4_ = fVar125 * auVar287._4_4_;
    auVar265._8_4_ = fVar125 * auVar287._8_4_;
    auVar265._12_4_ = fVar125 * auVar287._12_4_;
    auVar126 = vminps_avx(auVar194,auVar265);
    auVar313._0_4_ = auVar75._0_4_ + auVar126._0_4_;
    auVar313._4_4_ = auVar75._4_4_ + auVar126._4_4_;
    auVar313._8_4_ = auVar75._8_4_ + auVar126._8_4_;
    auVar313._12_4_ = auVar75._12_4_ + auVar126._12_4_;
    fVar234 = auVar154._0_4_;
    auVar324._0_4_ = fVar234 * auVar127._0_4_;
    fVar235 = auVar154._4_4_;
    auVar324._4_4_ = fVar235 * auVar127._4_4_;
    fVar236 = auVar154._8_4_;
    auVar324._8_4_ = fVar236 * auVar127._8_4_;
    fVar237 = auVar154._12_4_;
    auVar324._12_4_ = fVar237 * auVar127._12_4_;
    auVar75 = vmaxps_avx(auVar265,auVar194);
    auVar266._0_4_ = fVar234 * auVar128._0_4_;
    auVar266._4_4_ = fVar235 * auVar128._4_4_;
    auVar266._8_4_ = fVar236 * auVar128._8_4_;
    auVar266._12_4_ = fVar237 * auVar128._12_4_;
    fVar142 = auVar179._0_4_;
    auVar116._0_4_ = fVar142 * auVar127._0_4_;
    fVar143 = auVar179._4_4_;
    auVar116._4_4_ = fVar143 * auVar127._4_4_;
    fVar144 = auVar179._8_4_;
    auVar116._8_4_ = fVar144 * auVar127._8_4_;
    fVar163 = auVar179._12_4_;
    auVar116._12_4_ = fVar163 * auVar127._12_4_;
    auVar280._0_4_ = fVar142 * auVar128._0_4_;
    auVar280._4_4_ = fVar143 * auVar128._4_4_;
    auVar280._8_4_ = fVar144 * auVar128._8_4_;
    auVar280._12_4_ = fVar163 * auVar128._12_4_;
    auVar136._0_4_ = auVar15._0_4_ + auVar75._0_4_;
    auVar136._4_4_ = auVar15._4_4_ + auVar75._4_4_;
    auVar136._8_4_ = auVar15._8_4_ + auVar75._8_4_;
    auVar136._12_4_ = auVar15._12_4_ + auVar75._12_4_;
    auVar195._8_8_ = 0x3f800000;
    auVar195._0_8_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar195,auVar136);
    auVar75 = vsubps_avx(auVar195,auVar313);
    auVar314._0_4_ = fVar234 * auVar15._0_4_;
    auVar314._4_4_ = fVar235 * auVar15._4_4_;
    auVar314._8_4_ = fVar236 * auVar15._8_4_;
    auVar314._12_4_ = fVar237 * auVar15._12_4_;
    auVar299._0_4_ = fVar234 * auVar75._0_4_;
    auVar299._4_4_ = fVar235 * auVar75._4_4_;
    auVar299._8_4_ = fVar236 * auVar75._8_4_;
    auVar299._12_4_ = fVar237 * auVar75._12_4_;
    auVar137._0_4_ = fVar142 * auVar15._0_4_;
    auVar137._4_4_ = fVar143 * auVar15._4_4_;
    auVar137._8_4_ = fVar144 * auVar15._8_4_;
    auVar137._12_4_ = fVar163 * auVar15._12_4_;
    auVar196._0_4_ = fVar142 * auVar75._0_4_;
    auVar196._4_4_ = fVar143 * auVar75._4_4_;
    auVar196._8_4_ = fVar144 * auVar75._8_4_;
    auVar196._12_4_ = fVar163 * auVar75._12_4_;
    auVar15 = vminps_avx(auVar314,auVar299);
    auVar75 = vminps_avx(auVar137,auVar196);
    auVar15 = vminps_avx(auVar15,auVar75);
    auVar75 = vmaxps_avx(auVar299,auVar314);
    auVar126 = vmaxps_avx(auVar196,auVar137);
    auVar287 = vminps_avx(auVar324,auVar266);
    auVar127 = vminps_avx(auVar116,auVar280);
    auVar287 = vminps_avx(auVar287,auVar127);
    auVar15 = vhaddps_avx(auVar15,auVar287);
    auVar75 = vmaxps_avx(auVar126,auVar75);
    auVar126 = vmaxps_avx(auVar266,auVar324);
    auVar287 = vmaxps_avx(auVar280,auVar116);
    auVar126 = vmaxps_avx(auVar287,auVar126);
    auVar75 = vhaddps_avx(auVar75,auVar126);
    auVar15 = vshufps_avx(auVar15,auVar15,0xe8);
    auVar75 = vshufps_avx(auVar75,auVar75,0xe8);
    auVar281._0_4_ = auVar189._0_4_ + auVar15._0_4_;
    auVar281._4_4_ = auVar189._4_4_ + auVar15._4_4_;
    auVar281._8_4_ = auVar189._8_4_ + auVar15._8_4_;
    auVar281._12_4_ = auVar189._12_4_ + auVar15._12_4_;
    auVar267._0_4_ = auVar189._0_4_ + auVar75._0_4_;
    auVar267._4_4_ = auVar189._4_4_ + auVar75._4_4_;
    auVar267._8_4_ = auVar189._8_4_ + auVar75._8_4_;
    auVar267._12_4_ = auVar189._12_4_ + auVar75._12_4_;
    auVar15 = vmaxps_avx(auVar296,auVar281);
    auVar75 = vminps_avx(auVar267,auVar73);
    auVar15 = vcmpps_avx(auVar75,auVar15,1);
    auVar15 = vshufps_avx(auVar15,auVar15,0x50);
    if ((auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar15[0xf] < '\0')
    goto LAB_01736fcd;
    bVar64 = 0;
    if (auVar281._0_4_ <= fVar178) {
      auVar336 = ZEXT864(0) << 0x40;
    }
    else {
      auVar336 = ZEXT864(0) << 0x20;
      bVar64 = 0;
      if (auVar267._0_4_ < auVar73._0_4_) {
        auVar75 = vmovshdup_avx(auVar281);
        auVar15 = vcmpps_avx(auVar267,auVar73,1);
        bVar64 = auVar15[4] & auVar200._0_4_ < auVar75._0_4_;
      }
    }
    if (((3 < uVar68 || fVar99 < 0.001) | bVar64) != 1) {
      auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)fVar101),0x10);
      auVar304 = ZEXT1664(auVar14);
      auVar14 = vinsertps_avx(auVar200,ZEXT416((uint)auVar219._0_4_),0x10);
      auVar336 = ZEXT1664(auVar14);
      goto LAB_01736b92;
    }
    lVar63 = 200;
    do {
      fVar142 = auVar189._0_4_;
      fVar178 = 1.0 - fVar142;
      fVar99 = fVar178 * fVar178 * fVar178;
      fVar101 = fVar142 * 3.0 * fVar178 * fVar178;
      fVar178 = fVar178 * fVar142 * fVar142 * 3.0;
      auVar174._4_4_ = fVar99;
      auVar174._0_4_ = fVar99;
      auVar174._8_4_ = fVar99;
      auVar174._12_4_ = fVar99;
      auVar138._4_4_ = fVar101;
      auVar138._0_4_ = fVar101;
      auVar138._8_4_ = fVar101;
      auVar138._12_4_ = fVar101;
      auVar117._4_4_ = fVar178;
      auVar117._0_4_ = fVar178;
      auVar117._8_4_ = fVar178;
      auVar117._12_4_ = fVar178;
      fVar142 = fVar142 * fVar142 * fVar142;
      local_598 = auVar19._0_4_;
      fStack_594 = auVar19._4_4_;
      fStack_590 = auVar19._8_4_;
      fStack_58c = auVar19._12_4_;
      auVar197._0_4_ = fVar142 * local_598;
      auVar197._4_4_ = fVar142 * fStack_594;
      auVar197._8_4_ = fVar142 * fStack_590;
      auVar197._12_4_ = fVar142 * fStack_58c;
      auVar14 = vfmadd231ps_fma(auVar197,auVar186,auVar117);
      auVar14 = vfmadd231ps_fma(auVar14,auVar18,auVar138);
      auVar14 = vfmadd231ps_fma(auVar14,auVar17,auVar174);
      auVar118._8_8_ = auVar14._0_8_;
      auVar118._0_8_ = auVar14._0_8_;
      auVar14 = vshufpd_avx(auVar14,auVar14,3);
      auVar15 = vshufps_avx(auVar189,auVar189,0x55);
      auVar14 = vsubps_avx(auVar14,auVar118);
      auVar15 = vfmadd213ps_fma(auVar14,auVar15,auVar118);
      fVar99 = auVar15._0_4_;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar119._0_4_ = fVar146 * fVar99 + fVar125 * auVar14._0_4_;
      auVar119._4_4_ = auVar87._4_4_ * fVar99 + auVar74._4_4_ * auVar14._4_4_;
      auVar119._8_4_ = auVar87._8_4_ * fVar99 + auVar74._8_4_ * auVar14._8_4_;
      auVar119._12_4_ = auVar87._12_4_ * fVar99 + auVar74._12_4_ * auVar14._12_4_;
      auVar189 = vsubps_avx(auVar189,auVar119);
      auVar14 = vandps_avx(auVar328,auVar15);
      auVar15 = vshufps_avx(auVar14,auVar14,0xf5);
      auVar14 = vmaxss_avx(auVar15,auVar14);
      if (auVar14._0_4_ < fVar98) {
        local_198 = auVar189._0_4_;
        if ((0.0 <= local_198) && (local_198 <= 1.0)) {
          auVar14 = vmovshdup_avx(auVar189);
          fVar99 = auVar14._0_4_;
          if ((0.0 <= fVar99) && (fVar99 <= 1.0)) {
            auVar14 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar126 = vinsertps_avx(auVar14,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                     0x28);
            auVar14 = vdpps_avx(auVar126,local_3e8,0x7f);
            auVar15 = vdpps_avx(auVar126,local_3f8,0x7f);
            auVar87 = vdpps_avx(auVar126,local_268,0x7f);
            auVar74 = vdpps_avx(auVar126,local_278,0x7f);
            auVar75 = vdpps_avx(auVar126,local_288,0x7f);
            auVar296 = vdpps_avx(auVar126,local_298,0x7f);
            auVar73 = vdpps_avx(auVar126,local_2a8,0x7f);
            auVar126 = vdpps_avx(auVar126,local_2b8,0x7f);
            fVar101 = 1.0 - fVar99;
            auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * auVar75._0_4_)),ZEXT416((uint)fVar101)
                                      ,auVar14);
            auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar296._0_4_ * fVar99)),
                                      ZEXT416((uint)fVar101),auVar15);
            auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar99)),ZEXT416((uint)fVar101)
                                      ,auVar87);
            auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * auVar126._0_4_)),
                                      ZEXT416((uint)fVar101),auVar74);
            fVar146 = 1.0 - local_198;
            fVar99 = fVar146 * local_198 * local_198 * 3.0;
            fVar142 = local_198 * local_198 * local_198;
            auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * fVar142)),ZEXT416((uint)fVar99)
                                      ,auVar87);
            fVar101 = local_198 * 3.0 * fVar146 * fVar146;
            auVar15 = vfmadd231ss_fma(auVar87,ZEXT416((uint)fVar101),auVar15);
            fVar178 = fVar146 * fVar146 * fVar146;
            auVar14 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar178),auVar14);
            fVar125 = auVar14._0_4_;
            if ((fVar71 <= fVar125) &&
               (fVar143 = *(float *)(ray + k * 4 + 0x80), fVar125 <= fVar143)) {
              pGVar7 = (context->scene->geometries).items[uVar60].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar70 = false;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar70 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_188 = vshufps_avx(auVar189,auVar189,0x55);
                auVar250._8_4_ = 0x3f800000;
                auVar250._0_8_ = 0x3f8000003f800000;
                auVar250._12_4_ = 0x3f800000;
                auVar14 = vsubps_avx(auVar250,local_188);
                fVar144 = local_188._0_4_;
                auVar268._0_4_ = fVar144 * (float)local_428._0_4_;
                fVar163 = local_188._4_4_;
                auVar268._4_4_ = fVar163 * (float)local_428._4_4_;
                fVar234 = local_188._8_4_;
                auVar268._8_4_ = fVar234 * fStack_420;
                fVar235 = local_188._12_4_;
                auVar268._12_4_ = fVar235 * fStack_41c;
                auVar282._0_4_ = fVar144 * (float)local_438._0_4_;
                auVar282._4_4_ = fVar163 * (float)local_438._4_4_;
                auVar282._8_4_ = fVar234 * fStack_430;
                auVar282._12_4_ = fVar235 * fStack_42c;
                local_508 = auVar21._0_4_;
                fStack_504 = auVar21._4_4_;
                fStack_500 = auVar21._8_4_;
                fStack_4fc = auVar21._12_4_;
                auVar290._0_4_ = fVar144 * local_508;
                auVar290._4_4_ = fVar163 * fStack_504;
                auVar290._8_4_ = fVar234 * fStack_500;
                auVar290._12_4_ = fVar235 * fStack_4fc;
                local_518 = auVar257._0_4_;
                fStack_514 = auVar257._4_4_;
                fStack_510 = auVar257._8_4_;
                fStack_50c = auVar257._12_4_;
                auVar300._0_4_ = fVar144 * local_518;
                auVar300._4_4_ = fVar163 * fStack_514;
                auVar300._8_4_ = fVar234 * fStack_510;
                auVar300._12_4_ = fVar235 * fStack_50c;
                auVar15 = vfmadd231ps_fma(auVar268,auVar14,local_408);
                auVar87 = vfmadd231ps_fma(auVar282,auVar14,auVar183);
                auVar74 = vfmadd231ps_fma(auVar290,auVar14,local_418);
                auVar75 = vfmadd231ps_fma(auVar300,auVar14,auVar20);
                auVar14 = vsubps_avx(auVar87,auVar15);
                auVar15 = vsubps_avx(auVar74,auVar87);
                auVar87 = vsubps_avx(auVar75,auVar74);
                auVar291._0_4_ = auVar15._0_4_ * local_198;
                auVar291._4_4_ = auVar15._4_4_ * local_198;
                auVar291._8_4_ = auVar15._8_4_ * local_198;
                auVar291._12_4_ = auVar15._12_4_ * local_198;
                auVar217._4_4_ = fVar146;
                auVar217._0_4_ = fVar146;
                auVar217._8_4_ = fVar146;
                auVar217._12_4_ = fVar146;
                auVar14 = vfmadd231ps_fma(auVar291,auVar217,auVar14);
                auVar251._0_4_ = auVar87._0_4_ * local_198;
                auVar251._4_4_ = auVar87._4_4_ * local_198;
                auVar251._8_4_ = auVar87._8_4_ * local_198;
                auVar251._12_4_ = auVar87._12_4_ * local_198;
                auVar15 = vfmadd231ps_fma(auVar251,auVar217,auVar15);
                auVar252._0_4_ = auVar15._0_4_ * local_198;
                auVar252._4_4_ = auVar15._4_4_ * local_198;
                auVar252._8_4_ = auVar15._8_4_ * local_198;
                auVar252._12_4_ = auVar15._12_4_ * local_198;
                auVar15 = vfmadd231ps_fma(auVar252,auVar217,auVar14);
                auVar198._0_4_ = fVar142 * (float)local_338._0_4_;
                auVar198._4_4_ = fVar142 * (float)local_338._4_4_;
                auVar198._8_4_ = fVar142 * fStack_330;
                auVar198._12_4_ = fVar142 * fStack_32c;
                auVar139._4_4_ = fVar99;
                auVar139._0_4_ = fVar99;
                auVar139._8_4_ = fVar99;
                auVar139._12_4_ = fVar99;
                auVar14 = vfmadd132ps_fma(auVar139,auVar198,local_328);
                auVar175._4_4_ = fVar101;
                auVar175._0_4_ = fVar101;
                auVar175._8_4_ = fVar101;
                auVar175._12_4_ = fVar101;
                auVar14 = vfmadd132ps_fma(auVar175,auVar14,local_318);
                auVar140._0_4_ = auVar15._0_4_ * 3.0;
                auVar140._4_4_ = auVar15._4_4_ * 3.0;
                auVar140._8_4_ = auVar15._8_4_ * 3.0;
                auVar140._12_4_ = auVar15._12_4_ * 3.0;
                auVar159._4_4_ = fVar178;
                auVar159._0_4_ = fVar178;
                auVar159._8_4_ = fVar178;
                auVar159._12_4_ = fVar178;
                auVar15 = vfmadd132ps_fma(auVar159,auVar14,local_308);
                auVar14 = vshufps_avx(auVar140,auVar140,0xc9);
                auVar176._0_4_ = auVar15._0_4_ * auVar14._0_4_;
                auVar176._4_4_ = auVar15._4_4_ * auVar14._4_4_;
                auVar176._8_4_ = auVar15._8_4_ * auVar14._8_4_;
                auVar176._12_4_ = auVar15._12_4_ * auVar14._12_4_;
                auVar14 = vshufps_avx(auVar15,auVar15,0xc9);
                auVar15 = vfmsub231ps_fma(auVar176,auVar140,auVar14);
                auVar14 = vshufps_avx(auVar15,auVar15,0x55);
                local_1c8[0] = (RTCHitN)auVar14[0];
                local_1c8[1] = (RTCHitN)auVar14[1];
                local_1c8[2] = (RTCHitN)auVar14[2];
                local_1c8[3] = (RTCHitN)auVar14[3];
                local_1c8[4] = (RTCHitN)auVar14[4];
                local_1c8[5] = (RTCHitN)auVar14[5];
                local_1c8[6] = (RTCHitN)auVar14[6];
                local_1c8[7] = (RTCHitN)auVar14[7];
                local_1c8[8] = (RTCHitN)auVar14[8];
                local_1c8[9] = (RTCHitN)auVar14[9];
                local_1c8[10] = (RTCHitN)auVar14[10];
                local_1c8[0xb] = (RTCHitN)auVar14[0xb];
                local_1c8[0xc] = (RTCHitN)auVar14[0xc];
                local_1c8[0xd] = (RTCHitN)auVar14[0xd];
                local_1c8[0xe] = (RTCHitN)auVar14[0xe];
                local_1c8[0xf] = (RTCHitN)auVar14[0xf];
                local_1b8 = vshufps_avx(auVar15,auVar15,0xaa);
                local_1a8 = auVar15._0_4_;
                uStack_1a4 = local_1a8;
                uStack_1a0 = local_1a8;
                uStack_19c = local_1a8;
                fStack_194 = local_198;
                fStack_190 = local_198;
                fStack_18c = local_198;
                local_178 = CONCAT44(uStack_2f4,local_2f8);
                uStack_170 = CONCAT44(uStack_2ec,uStack_2f0);
                local_168._4_4_ = uStack_2e4;
                local_168._0_4_ = local_2e8;
                local_168._8_4_ = uStack_2e0;
                local_168._12_4_ = uStack_2dc;
                vpcmpeqd_avx2(ZEXT1632(local_168),ZEXT1632(local_168));
                uStack_154 = context->user->instID[0];
                local_158 = uStack_154;
                uStack_150 = uStack_154;
                uStack_14c = uStack_154;
                uStack_148 = context->user->instPrimID[0];
                uStack_144 = uStack_148;
                uStack_140 = uStack_148;
                uStack_13c = uStack_148;
                *(float *)(ray + k * 4 + 0x80) = fVar125;
                local_458 = *local_448;
                local_388.valid = (int *)local_458;
                local_388.geometryUserPtr = pGVar7->userPtr;
                local_388.context = context->user;
                local_388.ray = (RTCRayN *)ray;
                local_388.hit = local_1c8;
                local_388.N = 4;
                local_358._0_4_ = (int)uVar61;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar7->occlusionFilterN)(&local_388);
                  uVar61 = (ulong)(uint)local_358._0_4_;
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                if (local_458 == (undefined1  [16])0x0) {
                  auVar14 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar14 = auVar14 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var13)(&local_388);
                    uVar61 = (ulong)(uint)local_358._0_4_;
                    auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar15 = vpcmpeqd_avx(local_458,_DAT_01f7aa10);
                  auVar14 = auVar15 ^ _DAT_01f7ae20;
                  auVar141._8_4_ = 0xff800000;
                  auVar141._0_8_ = 0xff800000ff800000;
                  auVar141._12_4_ = 0xff800000;
                  auVar15 = vblendvps_avx(auVar141,*(undefined1 (*) [16])(local_388.ray + 0x80),
                                          auVar15);
                  *(undefined1 (*) [16])(local_388.ray + 0x80) = auVar15;
                }
                auVar120._8_8_ = 0x100000001;
                auVar120._0_8_ = 0x100000001;
                bVar70 = (auVar120 & auVar14) != (undefined1  [16])0x0;
                if (!bVar70) {
                  *(float *)(ray + k * 4 + 0x80) = fVar143;
                }
              }
              uVar61 = CONCAT71((int7)(uVar61 >> 8),(byte)uVar61 | bVar70);
            }
          }
        }
        break;
      }
      lVar63 = lVar63 + -1;
    } while (lVar63 != 0);
  }
  goto LAB_01737123;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }